

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  Primitive PVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  bool bVar54;
  bool bVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  bool bVar70;
  uint uVar71;
  ulong uVar72;
  long lVar73;
  uint uVar74;
  long lVar75;
  uint uVar77;
  ulong uVar78;
  ulong uVar79;
  bool bVar80;
  vint4 bi_1;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  float fVar95;
  float fVar116;
  vint4 bi_2;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  vint4 ai;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  float fVar152;
  float fVar153;
  vint4 bi;
  undefined1 auVar134 [16];
  float fVar154;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar155;
  float fVar172;
  float fVar173;
  vint4 ai_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar174;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar175;
  float fVar193;
  float fVar194;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar195;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar202 [16];
  float fVar208;
  float fVar209;
  undefined1 auVar207 [32];
  vfloat4 b0;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  vint4 ai_1;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar249;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  float fVar250;
  float fVar259;
  float fVar260;
  __m128 a;
  float fVar261;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  float fVar262;
  float fVar271;
  float fVar272;
  vfloat4 a0_1;
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar274;
  float fVar275;
  float fVar279;
  float fVar281;
  undefined1 auVar276 [16];
  float fVar283;
  undefined1 auVar277 [16];
  float fVar280;
  float fVar282;
  float fVar284;
  undefined1 auVar278 [16];
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar299;
  float fVar300;
  undefined1 auVar293 [16];
  undefined1 auVar295 [16];
  float fVar301;
  undefined1 auVar294 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar302;
  float fVar303;
  undefined1 auVar298 [32];
  float fVar304;
  float fVar305;
  float fVar311;
  float fVar313;
  float fVar315;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar312;
  float fVar314;
  undefined1 auVar310 [64];
  vfloat4 a0;
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar321 [64];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_6f1;
  undefined1 local_6b0 [8];
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float local_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  uint auStack_480 [4];
  RTCFilterFunctionNArguments local_470;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar76;
  undefined1 auVar151 [32];
  undefined1 auVar320 [32];
  
  PVar9 = prim[1];
  uVar79 = (ulong)(byte)PVar9;
  fVar133 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar104 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar200 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar200 = vinsertps_avx(auVar200,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar104 = vsubps_avx(auVar104,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar96._0_4_ = fVar133 * auVar104._0_4_;
  auVar96._4_4_ = fVar133 * auVar104._4_4_;
  auVar96._8_4_ = fVar133 * auVar104._8_4_;
  auVar96._12_4_ = fVar133 * auVar104._12_4_;
  auVar176._0_4_ = fVar133 * auVar200._0_4_;
  auVar176._4_4_ = fVar133 * auVar200._4_4_;
  auVar176._8_4_ = fVar133 * auVar200._8_4_;
  auVar176._12_4_ = fVar133 * auVar200._12_4_;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 6)));
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar265 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar9 * 0xc + uVar79 + 6)));
  auVar265 = vcvtdq2ps_avx(auVar265);
  auVar17 = vcvtdq2ps_avx(auVar17);
  uVar72 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + uVar79 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar72 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar81 = vshufps_avx(auVar176,auVar176,0);
  auVar86 = vshufps_avx(auVar176,auVar176,0x55);
  auVar122 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar133 = auVar122._0_4_;
  fVar155 = auVar122._4_4_;
  fVar175 = auVar122._8_4_;
  fVar152 = auVar122._12_4_;
  fVar194 = auVar86._0_4_;
  fVar154 = auVar86._4_4_;
  fVar174 = auVar86._8_4_;
  fVar195 = auVar86._12_4_;
  fVar172 = auVar81._0_4_;
  fVar193 = auVar81._4_4_;
  fVar153 = auVar81._8_4_;
  fVar173 = auVar81._12_4_;
  auVar276._0_4_ = fVar172 * auVar104._0_4_ + fVar194 * auVar200._0_4_ + fVar133 * auVar191._0_4_;
  auVar276._4_4_ = fVar193 * auVar104._4_4_ + fVar154 * auVar200._4_4_ + fVar155 * auVar191._4_4_;
  auVar276._8_4_ = fVar153 * auVar104._8_4_ + fVar174 * auVar200._8_4_ + fVar175 * auVar191._8_4_;
  auVar276._12_4_ =
       fVar173 * auVar104._12_4_ + fVar195 * auVar200._12_4_ + fVar152 * auVar191._12_4_;
  auVar293._0_4_ = fVar172 * auVar16._0_4_ + fVar194 * auVar265._0_4_ + auVar17._0_4_ * fVar133;
  auVar293._4_4_ = fVar193 * auVar16._4_4_ + fVar154 * auVar265._4_4_ + auVar17._4_4_ * fVar155;
  auVar293._8_4_ = fVar153 * auVar16._8_4_ + fVar174 * auVar265._8_4_ + auVar17._8_4_ * fVar175;
  auVar293._12_4_ = fVar173 * auVar16._12_4_ + fVar195 * auVar265._12_4_ + auVar17._12_4_ * fVar152;
  auVar177._0_4_ = fVar172 * auVar82._0_4_ + fVar194 * auVar83._0_4_ + auVar103._0_4_ * fVar133;
  auVar177._4_4_ = fVar193 * auVar82._4_4_ + fVar154 * auVar83._4_4_ + auVar103._4_4_ * fVar155;
  auVar177._8_4_ = fVar153 * auVar82._8_4_ + fVar174 * auVar83._8_4_ + auVar103._8_4_ * fVar175;
  auVar177._12_4_ = fVar173 * auVar82._12_4_ + fVar195 * auVar83._12_4_ + auVar103._12_4_ * fVar152;
  auVar81 = vshufps_avx(auVar96,auVar96,0);
  auVar86 = vshufps_avx(auVar96,auVar96,0x55);
  auVar122 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar133 = auVar122._0_4_;
  fVar155 = auVar122._4_4_;
  fVar175 = auVar122._8_4_;
  fVar152 = auVar122._12_4_;
  fVar194 = auVar86._0_4_;
  fVar154 = auVar86._4_4_;
  fVar174 = auVar86._8_4_;
  fVar195 = auVar86._12_4_;
  fVar172 = auVar81._0_4_;
  fVar193 = auVar81._4_4_;
  fVar153 = auVar81._8_4_;
  fVar173 = auVar81._12_4_;
  auVar196._0_4_ = fVar172 * auVar104._0_4_ + fVar194 * auVar200._0_4_ + fVar133 * auVar191._0_4_;
  auVar196._4_4_ = fVar193 * auVar104._4_4_ + fVar154 * auVar200._4_4_ + fVar155 * auVar191._4_4_;
  auVar196._8_4_ = fVar153 * auVar104._8_4_ + fVar174 * auVar200._8_4_ + fVar175 * auVar191._8_4_;
  auVar196._12_4_ =
       fVar173 * auVar104._12_4_ + fVar195 * auVar200._12_4_ + fVar152 * auVar191._12_4_;
  auVar81._0_4_ = fVar172 * auVar16._0_4_ + auVar17._0_4_ * fVar133 + fVar194 * auVar265._0_4_;
  auVar81._4_4_ = fVar193 * auVar16._4_4_ + auVar17._4_4_ * fVar155 + fVar154 * auVar265._4_4_;
  auVar81._8_4_ = fVar153 * auVar16._8_4_ + auVar17._8_4_ * fVar175 + fVar174 * auVar265._8_4_;
  auVar81._12_4_ = fVar173 * auVar16._12_4_ + auVar17._12_4_ * fVar152 + fVar195 * auVar265._12_4_;
  auVar218._8_4_ = 0x7fffffff;
  auVar218._0_8_ = 0x7fffffff7fffffff;
  auVar218._12_4_ = 0x7fffffff;
  auVar104 = vandps_avx(auVar276,auVar218);
  auVar156._8_4_ = 0x219392ef;
  auVar156._0_8_ = 0x219392ef219392ef;
  auVar156._12_4_ = 0x219392ef;
  auVar104 = vcmpps_avx(auVar104,auVar156,1);
  auVar200 = vblendvps_avx(auVar276,auVar156,auVar104);
  auVar104 = vandps_avx(auVar293,auVar218);
  auVar104 = vcmpps_avx(auVar104,auVar156,1);
  auVar191 = vblendvps_avx(auVar293,auVar156,auVar104);
  auVar104 = vandps_avx(auVar218,auVar177);
  auVar104 = vcmpps_avx(auVar104,auVar156,1);
  auVar104 = vblendvps_avx(auVar177,auVar156,auVar104);
  auVar86._0_4_ = fVar172 * auVar82._0_4_ + fVar194 * auVar83._0_4_ + auVar103._0_4_ * fVar133;
  auVar86._4_4_ = fVar193 * auVar82._4_4_ + fVar154 * auVar83._4_4_ + auVar103._4_4_ * fVar155;
  auVar86._8_4_ = fVar153 * auVar82._8_4_ + fVar174 * auVar83._8_4_ + auVar103._8_4_ * fVar175;
  auVar86._12_4_ = fVar173 * auVar82._12_4_ + fVar195 * auVar83._12_4_ + auVar103._12_4_ * fVar152;
  auVar16 = vrcpps_avx(auVar200);
  fVar133 = auVar16._0_4_;
  auVar134._0_4_ = fVar133 * auVar200._0_4_;
  fVar152 = auVar16._4_4_;
  auVar134._4_4_ = fVar152 * auVar200._4_4_;
  fVar153 = auVar16._8_4_;
  auVar134._8_4_ = fVar153 * auVar200._8_4_;
  fVar154 = auVar16._12_4_;
  auVar134._12_4_ = fVar154 * auVar200._12_4_;
  auVar219._8_4_ = 0x3f800000;
  auVar219._0_8_ = &DAT_3f8000003f800000;
  auVar219._12_4_ = 0x3f800000;
  auVar200 = vsubps_avx(auVar219,auVar134);
  fVar133 = fVar133 + fVar133 * auVar200._0_4_;
  fVar152 = fVar152 + fVar152 * auVar200._4_4_;
  fVar153 = fVar153 + fVar153 * auVar200._8_4_;
  fVar154 = fVar154 + fVar154 * auVar200._12_4_;
  auVar200 = vrcpps_avx(auVar191);
  fVar155 = auVar200._0_4_;
  auVar157._0_4_ = fVar155 * auVar191._0_4_;
  fVar172 = auVar200._4_4_;
  auVar157._4_4_ = fVar172 * auVar191._4_4_;
  fVar173 = auVar200._8_4_;
  auVar157._8_4_ = fVar173 * auVar191._8_4_;
  fVar174 = auVar200._12_4_;
  auVar157._12_4_ = fVar174 * auVar191._12_4_;
  auVar200 = vsubps_avx(auVar219,auVar157);
  fVar155 = fVar155 + fVar155 * auVar200._0_4_;
  fVar172 = fVar172 + fVar172 * auVar200._4_4_;
  fVar173 = fVar173 + fVar173 * auVar200._8_4_;
  fVar174 = fVar174 + fVar174 * auVar200._12_4_;
  auVar200 = vrcpps_avx(auVar104);
  fVar175 = auVar200._0_4_;
  auVar178._0_4_ = fVar175 * auVar104._0_4_;
  fVar193 = auVar200._4_4_;
  auVar178._4_4_ = fVar193 * auVar104._4_4_;
  fVar194 = auVar200._8_4_;
  auVar178._8_4_ = fVar194 * auVar104._8_4_;
  fVar195 = auVar200._12_4_;
  auVar178._12_4_ = fVar195 * auVar104._12_4_;
  auVar200 = vsubps_avx(auVar219,auVar178);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar104 = vpmovsxwd_avx(auVar104);
  fVar175 = fVar175 + fVar175 * auVar200._0_4_;
  fVar193 = fVar193 + fVar193 * auVar200._4_4_;
  fVar194 = fVar194 + fVar194 * auVar200._8_4_;
  fVar195 = fVar195 + fVar195 * auVar200._12_4_;
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar196);
  auVar122._0_4_ = fVar133 * auVar104._0_4_;
  auVar122._4_4_ = fVar152 * auVar104._4_4_;
  auVar122._8_4_ = fVar153 * auVar104._8_4_;
  auVar122._12_4_ = fVar154 * auVar104._12_4_;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar104 = vpmovsxwd_avx(auVar200);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar196);
  auVar135._0_4_ = fVar133 * auVar104._0_4_;
  auVar135._4_4_ = fVar152 * auVar104._4_4_;
  auVar135._8_4_ = fVar153 * auVar104._8_4_;
  auVar135._12_4_ = fVar154 * auVar104._12_4_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + 6);
  auVar200 = vpmovsxwd_avx(auVar191);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar79 * -2 + 6);
  auVar104 = vpmovsxwd_avx(auVar16);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar81);
  auVar220._0_4_ = auVar104._0_4_ * fVar155;
  auVar220._4_4_ = auVar104._4_4_ * fVar172;
  auVar220._8_4_ = auVar104._8_4_ * fVar173;
  auVar220._12_4_ = auVar104._12_4_ * fVar174;
  auVar104 = vcvtdq2ps_avx(auVar200);
  auVar104 = vsubps_avx(auVar104,auVar81);
  auVar82._0_4_ = fVar155 * auVar104._0_4_;
  auVar82._4_4_ = fVar172 * auVar104._4_4_;
  auVar82._8_4_ = fVar173 * auVar104._8_4_;
  auVar82._12_4_ = fVar174 * auVar104._12_4_;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *(ulong *)(prim + uVar72 + uVar79 + 6);
  auVar104 = vpmovsxwd_avx(auVar265);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar86);
  auVar158._0_4_ = auVar104._0_4_ * fVar175;
  auVar158._4_4_ = auVar104._4_4_ * fVar193;
  auVar158._8_4_ = auVar104._8_4_ * fVar194;
  auVar158._12_4_ = auVar104._12_4_ * fVar195;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 6);
  auVar104 = vpmovsxwd_avx(auVar17);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar86);
  auVar103._0_4_ = auVar104._0_4_ * fVar175;
  auVar103._4_4_ = auVar104._4_4_ * fVar193;
  auVar103._8_4_ = auVar104._8_4_ * fVar194;
  auVar103._12_4_ = auVar104._12_4_ * fVar195;
  auVar104 = vpminsd_avx(auVar122,auVar135);
  auVar200 = vpminsd_avx(auVar220,auVar82);
  auVar104 = vmaxps_avx(auVar104,auVar200);
  auVar200 = vpminsd_avx(auVar158,auVar103);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar234._4_4_ = uVar6;
  auVar234._0_4_ = uVar6;
  auVar234._8_4_ = uVar6;
  auVar234._12_4_ = uVar6;
  auVar200 = vmaxps_avx(auVar200,auVar234);
  auVar104 = vmaxps_avx(auVar104,auVar200);
  local_3f0._0_4_ = auVar104._0_4_ * 0.99999964;
  local_3f0._4_4_ = auVar104._4_4_ * 0.99999964;
  local_3f0._8_4_ = auVar104._8_4_ * 0.99999964;
  local_3f0._12_4_ = auVar104._12_4_ * 0.99999964;
  auVar104 = vpmaxsd_avx(auVar122,auVar135);
  auVar200 = vpmaxsd_avx(auVar220,auVar82);
  auVar104 = vminps_avx(auVar104,auVar200);
  auVar200 = vpmaxsd_avx(auVar158,auVar103);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar118._4_4_ = uVar6;
  auVar118._0_4_ = uVar6;
  auVar118._8_4_ = uVar6;
  auVar118._12_4_ = uVar6;
  auVar200 = vminps_avx(auVar200,auVar118);
  auVar104 = vminps_avx(auVar104,auVar200);
  auVar83._0_4_ = auVar104._0_4_ * 1.0000004;
  auVar83._4_4_ = auVar104._4_4_ * 1.0000004;
  auVar83._8_4_ = auVar104._8_4_ * 1.0000004;
  auVar83._12_4_ = auVar104._12_4_ * 1.0000004;
  auVar104 = vpshufd_avx(ZEXT116((byte)PVar9),0);
  auVar200 = vpcmpgtd_avx(auVar104,_DAT_01ff0cf0);
  auVar104 = vcmpps_avx(local_3f0,auVar83,2);
  auVar104 = vandps_avx(auVar104,auVar200);
  uVar71 = vmovmskps_avx(auVar104);
  local_6f1 = uVar71 != 0;
  if (uVar71 == 0) {
    return local_6f1;
  }
  uVar71 = uVar71 & 0xff;
  auVar89._16_16_ = mm_lookupmask_ps._240_16_;
  auVar89._0_16_ = mm_lookupmask_ps._240_16_;
  uVar77 = 1 << ((byte)k & 0x1f);
  local_320 = vblendps_avx(auVar89,ZEXT832(0) << 0x20,0x80);
  uVar72 = (ulong)((uVar77 & 0xf) << 4);
  lVar75 = (long)((int)uVar77 >> 4) * 0x10;
  auVar321 = ZEXT464(0) << 0x20;
LAB_00ee7063:
  uVar79 = (ulong)uVar71;
  lVar73 = 0;
  if (uVar79 != 0) {
    for (; (uVar71 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
    }
  }
  uVar71 = *(uint *)(prim + 2);
  pGVar10 = (context->scene->geometries).items[uVar71].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar73 * 4 + 6));
  p_Var11 = pGVar10[1].intersectionFilterN;
  pvVar12 = pGVar10[2].userPtr;
  _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(_Var13 + uVar78 * (long)pvVar12);
  fVar133 = *pfVar3;
  fVar155 = pfVar3[1];
  fVar175 = pfVar3[2];
  fVar152 = pfVar3[3];
  pfVar4 = (float *)(_Var13 + (uVar78 + 1) * (long)pvVar12);
  pfVar5 = (float *)(_Var13 + (uVar78 + 2) * (long)pvVar12);
  pfVar3 = (float *)(_Var13 + (long)pvVar12 * (uVar78 + 3));
  fVar172 = *pfVar3;
  fVar193 = pfVar3[1];
  fVar153 = pfVar3[2];
  fVar173 = pfVar3[3];
  uVar79 = uVar79 - 1 & uVar79;
  lVar14 = *(long *)&pGVar10[1].time_range.upper;
  pfVar3 = (float *)(lVar14 + (long)p_Var11 * uVar78);
  fVar194 = *pfVar3;
  fVar154 = pfVar3[1];
  fVar174 = pfVar3[2];
  fVar195 = pfVar3[3];
  pfVar3 = (float *)(lVar14 + (long)p_Var11 * (uVar78 + 1));
  pfVar1 = (float *)(lVar14 + (long)p_Var11 * (uVar78 + 2));
  lVar15 = 0;
  if (uVar79 != 0) {
    for (; (uVar79 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
    }
  }
  pfVar2 = (float *)(lVar14 + (long)p_Var11 * (uVar78 + 3));
  fVar95 = *pfVar2;
  fVar116 = pfVar2[1];
  fVar249 = pfVar2[2];
  fVar117 = pfVar2[3];
  if (((uVar79 != 0) && (uVar78 = uVar79 - 1 & uVar79, uVar78 != 0)) && (lVar14 = 0, uVar78 != 0)) {
    for (; (uVar78 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
    }
  }
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar191 = vinsertps_avx(auVar104,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar313 = auVar321._8_4_;
  fVar315 = auVar321._12_4_;
  fVar250 = *pfVar1 * 0.0;
  fVar259 = pfVar1[1] * 0.0;
  fVar260 = fVar313 * pfVar1[2];
  fVar261 = fVar315 * pfVar1[3];
  fVar262 = fVar250 + fVar95 * 0.0;
  fVar271 = fVar259 + fVar116 * 0.0;
  fVar272 = fVar260 + fVar249 * fVar313;
  fVar273 = fVar261 + fVar117 * fVar315;
  fVar274 = *pfVar3 * 0.0;
  fVar279 = pfVar3[1] * 0.0;
  fVar281 = fVar313 * pfVar3[2];
  fVar283 = fVar315 * pfVar3[3];
  local_680._0_4_ = fVar194 + fVar274 + fVar262;
  local_680._4_4_ = fVar154 + fVar279 + fVar271;
  fStack_678 = fVar174 + fVar281 + fVar272;
  fStack_674 = fVar195 + fVar283 + fVar273;
  auVar119._0_4_ = fVar262 + *pfVar3 * 3.0;
  auVar119._4_4_ = fVar271 + pfVar3[1] * 3.0;
  auVar119._8_4_ = fVar272 + pfVar3[2] * 3.0;
  auVar119._12_4_ = fVar273 + pfVar3[3] * 3.0;
  auVar263._0_4_ = fVar194 * 3.0;
  auVar263._4_4_ = fVar154 * 3.0;
  auVar263._8_4_ = fVar174 * 3.0;
  auVar263._12_4_ = fVar195 * 3.0;
  auVar103 = vsubps_avx(auVar119,auVar263);
  fVar292 = *pfVar5 * 0.0;
  fVar299 = pfVar5[1] * 0.0;
  fVar300 = pfVar5[2] * fVar313;
  fVar301 = pfVar5[3] * fVar315;
  fVar262 = fVar292 + fVar172 * 0.0;
  fVar271 = fVar299 + fVar193 * 0.0;
  fVar272 = fVar300 + fVar313 * fVar153;
  fVar273 = fVar301 + fVar315 * fVar173;
  fVar304 = *pfVar4 * 0.0;
  fVar311 = pfVar4[1] * 0.0;
  fVar313 = fVar313 * pfVar4[2];
  fVar315 = fVar315 * pfVar4[3];
  auVar316._0_4_ = fVar304 + fVar262 + fVar133;
  auVar316._4_4_ = fVar311 + fVar271 + fVar155;
  auVar316._8_4_ = fVar313 + fVar272 + fVar175;
  auVar316._12_4_ = fVar315 + fVar273 + fVar152;
  auVar136._0_4_ = fVar262 + *pfVar4 * 3.0;
  auVar136._4_4_ = fVar271 + pfVar4[1] * 3.0;
  auVar136._8_4_ = fVar272 + pfVar4[2] * 3.0;
  auVar136._12_4_ = fVar273 + pfVar4[3] * 3.0;
  auVar264._0_4_ = fVar133 * 3.0;
  auVar264._4_4_ = fVar155 * 3.0;
  auVar264._8_4_ = fVar175 * 3.0;
  auVar264._12_4_ = fVar152 * 3.0;
  auVar265 = vsubps_avx(auVar136,auVar264);
  auVar221._0_4_ = fVar194 * 0.0;
  auVar221._4_4_ = fVar154 * 0.0;
  auVar221._8_4_ = fVar174 * 0.0;
  auVar221._12_4_ = fVar195 * 0.0;
  auVar137._0_4_ = auVar221._0_4_ + fVar274 + fVar250 + fVar95;
  auVar137._4_4_ = auVar221._4_4_ + fVar279 + fVar259 + fVar116;
  auVar137._8_4_ = auVar221._8_4_ + fVar281 + fVar260 + fVar249;
  auVar137._12_4_ = auVar221._12_4_ + fVar283 + fVar261 + fVar117;
  auVar235._0_4_ = fVar95 * 3.0;
  auVar235._4_4_ = fVar116 * 3.0;
  auVar235._8_4_ = fVar249 * 3.0;
  auVar235._12_4_ = fVar117 * 3.0;
  auVar159._0_4_ = *pfVar1 * 3.0;
  auVar159._4_4_ = pfVar1[1] * 3.0;
  auVar159._8_4_ = pfVar1[2] * 3.0;
  auVar159._12_4_ = pfVar1[3] * 3.0;
  auVar104 = vsubps_avx(auVar235,auVar159);
  auVar160._0_4_ = fVar274 + auVar104._0_4_;
  auVar160._4_4_ = fVar279 + auVar104._4_4_;
  auVar160._8_4_ = fVar281 + auVar104._8_4_;
  auVar160._12_4_ = fVar283 + auVar104._12_4_;
  auVar81 = vsubps_avx(auVar160,auVar221);
  auVar179._0_4_ = fVar133 * 0.0;
  auVar179._4_4_ = fVar155 * 0.0;
  auVar179._8_4_ = fVar175 * 0.0;
  auVar179._12_4_ = fVar152 * 0.0;
  auVar236._0_4_ = fVar304 + fVar292 + fVar172 + auVar179._0_4_;
  auVar236._4_4_ = fVar311 + fVar299 + fVar193 + auVar179._4_4_;
  auVar236._8_4_ = fVar313 + fVar300 + fVar153 + auVar179._8_4_;
  auVar236._12_4_ = fVar315 + fVar301 + fVar173 + auVar179._12_4_;
  auVar210._0_4_ = fVar172 * 3.0;
  auVar210._4_4_ = fVar193 * 3.0;
  auVar210._8_4_ = fVar153 * 3.0;
  auVar210._12_4_ = fVar173 * 3.0;
  auVar197._0_4_ = *pfVar5 * 3.0;
  auVar197._4_4_ = pfVar5[1] * 3.0;
  auVar197._8_4_ = pfVar5[2] * 3.0;
  auVar197._12_4_ = pfVar5[3] * 3.0;
  auVar104 = vsubps_avx(auVar210,auVar197);
  auVar198._0_4_ = fVar304 + auVar104._0_4_;
  auVar198._4_4_ = fVar311 + auVar104._4_4_;
  auVar198._8_4_ = fVar313 + auVar104._8_4_;
  auVar198._12_4_ = fVar315 + auVar104._12_4_;
  auVar82 = vsubps_avx(auVar198,auVar179);
  auVar104 = vshufps_avx(auVar103,auVar103,0xc9);
  auVar200 = vshufps_avx(auVar316,auVar316,0xc9);
  fVar249 = auVar103._0_4_;
  auVar211._0_4_ = fVar249 * auVar200._0_4_;
  fVar313 = auVar103._4_4_;
  auVar211._4_4_ = fVar313 * auVar200._4_4_;
  fVar250 = auVar103._8_4_;
  auVar211._8_4_ = fVar250 * auVar200._8_4_;
  fVar260 = auVar103._12_4_;
  auVar211._12_4_ = fVar260 * auVar200._12_4_;
  auVar222._0_4_ = auVar316._0_4_ * auVar104._0_4_;
  auVar222._4_4_ = auVar316._4_4_ * auVar104._4_4_;
  auVar222._8_4_ = auVar316._8_4_ * auVar104._8_4_;
  auVar222._12_4_ = auVar316._12_4_ * auVar104._12_4_;
  auVar200 = vsubps_avx(auVar222,auVar211);
  auVar16 = vshufps_avx(auVar200,auVar200,0xc9);
  auVar200 = vshufps_avx(auVar265,auVar265,0xc9);
  auVar212._0_4_ = fVar249 * auVar200._0_4_;
  auVar212._4_4_ = fVar313 * auVar200._4_4_;
  auVar212._8_4_ = fVar250 * auVar200._8_4_;
  auVar212._12_4_ = fVar260 * auVar200._12_4_;
  auVar180._0_4_ = auVar265._0_4_ * auVar104._0_4_;
  auVar180._4_4_ = auVar265._4_4_ * auVar104._4_4_;
  auVar180._8_4_ = auVar265._8_4_ * auVar104._8_4_;
  auVar180._12_4_ = auVar265._12_4_ * auVar104._12_4_;
  auVar104 = vsubps_avx(auVar180,auVar212);
  auVar265 = vshufps_avx(auVar104,auVar104,0xc9);
  auVar200 = vshufps_avx(auVar81,auVar81,0xc9);
  auVar104 = vshufps_avx(auVar236,auVar236,0xc9);
  fVar262 = auVar81._0_4_;
  auVar181._0_4_ = fVar262 * auVar104._0_4_;
  fVar271 = auVar81._4_4_;
  auVar181._4_4_ = fVar271 * auVar104._4_4_;
  fVar272 = auVar81._8_4_;
  auVar181._8_4_ = fVar272 * auVar104._8_4_;
  fVar273 = auVar81._12_4_;
  auVar181._12_4_ = fVar273 * auVar104._12_4_;
  auVar237._0_4_ = auVar236._0_4_ * auVar200._0_4_;
  auVar237._4_4_ = auVar236._4_4_ * auVar200._4_4_;
  auVar237._8_4_ = auVar236._8_4_ * auVar200._8_4_;
  auVar237._12_4_ = auVar236._12_4_ * auVar200._12_4_;
  auVar104 = vsubps_avx(auVar237,auVar181);
  auVar17 = vshufps_avx(auVar104,auVar104,0xc9);
  auVar104 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar238._0_4_ = auVar104._0_4_ * fVar262;
  auVar238._4_4_ = auVar104._4_4_ * fVar271;
  auVar238._8_4_ = auVar104._8_4_ * fVar272;
  auVar238._12_4_ = auVar104._12_4_ * fVar273;
  auVar104 = vdpps_avx(auVar16,auVar16,0x7f);
  auVar199._0_4_ = auVar200._0_4_ * auVar82._0_4_;
  auVar199._4_4_ = auVar200._4_4_ * auVar82._4_4_;
  auVar199._8_4_ = auVar200._8_4_ * auVar82._8_4_;
  auVar199._12_4_ = auVar200._12_4_ * auVar82._12_4_;
  auVar200 = vsubps_avx(auVar199,auVar238);
  auVar82 = vshufps_avx(auVar200,auVar200,0xc9);
  fVar172 = auVar104._0_4_;
  auVar122 = ZEXT416((uint)fVar172);
  auVar200 = vrsqrtss_avx(auVar122,auVar122);
  fVar133 = auVar200._0_4_;
  auVar200 = ZEXT416((uint)(fVar133 * 1.5 - fVar172 * 0.5 * fVar133 * fVar133 * fVar133));
  auVar83 = vshufps_avx(auVar200,auVar200,0);
  auVar200 = vdpps_avx(auVar16,auVar265,0x7f);
  fVar133 = auVar16._0_4_ * auVar83._0_4_;
  fVar155 = auVar16._4_4_ * auVar83._4_4_;
  fVar175 = auVar16._8_4_ * auVar83._8_4_;
  fVar152 = auVar16._12_4_ * auVar83._12_4_;
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar251._0_4_ = auVar265._0_4_ * auVar104._0_4_;
  auVar251._4_4_ = auVar265._4_4_ * auVar104._4_4_;
  auVar251._8_4_ = auVar265._8_4_ * auVar104._8_4_;
  auVar251._12_4_ = auVar265._12_4_ * auVar104._12_4_;
  auVar104 = vshufps_avx(auVar200,auVar200,0);
  auVar223._0_4_ = auVar16._0_4_ * auVar104._0_4_;
  auVar223._4_4_ = auVar16._4_4_ * auVar104._4_4_;
  auVar223._8_4_ = auVar16._8_4_ * auVar104._8_4_;
  auVar223._12_4_ = auVar16._12_4_ * auVar104._12_4_;
  auVar86 = vsubps_avx(auVar251,auVar223);
  auVar104 = vrcpss_avx(auVar122,auVar122);
  auVar104 = ZEXT416((uint)(auVar104._0_4_ * (2.0 - fVar172 * auVar104._0_4_)));
  auVar16 = vshufps_avx(auVar104,auVar104,0);
  auVar104 = vdpps_avx(auVar17,auVar17,0x7f);
  fVar172 = auVar104._0_4_;
  auVar122 = ZEXT416((uint)fVar172);
  auVar200 = vrsqrtss_avx(auVar122,auVar122);
  fVar193 = auVar200._0_4_;
  auVar200 = vdpps_avx(auVar17,auVar82,0x7f);
  auVar265 = ZEXT416((uint)(fVar193 * 1.5 - fVar172 * 0.5 * fVar193 * fVar193 * fVar193));
  auVar265 = vshufps_avx(auVar265,auVar265,0);
  fVar193 = auVar265._0_4_ * auVar17._0_4_;
  fVar153 = auVar265._4_4_ * auVar17._4_4_;
  fVar173 = auVar265._8_4_ * auVar17._8_4_;
  fVar194 = auVar265._12_4_ * auVar17._12_4_;
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar213._0_4_ = auVar104._0_4_ * auVar82._0_4_;
  auVar213._4_4_ = auVar104._4_4_ * auVar82._4_4_;
  auVar213._8_4_ = auVar104._8_4_ * auVar82._8_4_;
  auVar213._12_4_ = auVar104._12_4_ * auVar82._12_4_;
  auVar104 = vshufps_avx(auVar200,auVar200,0);
  auVar182._0_4_ = auVar104._0_4_ * auVar17._0_4_;
  auVar182._4_4_ = auVar104._4_4_ * auVar17._4_4_;
  auVar182._8_4_ = auVar104._8_4_ * auVar17._8_4_;
  auVar182._12_4_ = auVar104._12_4_ * auVar17._12_4_;
  auVar82 = vsubps_avx(auVar213,auVar182);
  auVar104 = vrcpss_avx(auVar122,auVar122);
  auVar104 = ZEXT416((uint)((2.0 - fVar172 * auVar104._0_4_) * auVar104._0_4_));
  auVar104 = vshufps_avx(auVar104,auVar104,0);
  auVar200 = vshufps_avx(_local_680,_local_680,0xff);
  auVar239._0_4_ = auVar200._0_4_ * fVar133;
  auVar239._4_4_ = auVar200._4_4_ * fVar155;
  auVar239._8_4_ = auVar200._8_4_ * fVar175;
  auVar239._12_4_ = auVar200._12_4_ * fVar152;
  _local_4b0 = vsubps_avx(_local_680,auVar239);
  auVar17 = vshufps_avx(auVar103,auVar103,0xff);
  auVar201._0_4_ =
       auVar17._0_4_ * fVar133 + auVar83._0_4_ * auVar86._0_4_ * auVar16._0_4_ * auVar200._0_4_;
  auVar201._4_4_ =
       auVar17._4_4_ * fVar155 + auVar83._4_4_ * auVar86._4_4_ * auVar16._4_4_ * auVar200._4_4_;
  auVar201._8_4_ =
       auVar17._8_4_ * fVar175 + auVar83._8_4_ * auVar86._8_4_ * auVar16._8_4_ * auVar200._8_4_;
  auVar201._12_4_ =
       auVar17._12_4_ * fVar152 + auVar83._12_4_ * auVar86._12_4_ * auVar16._12_4_ * auVar200._12_4_
  ;
  auVar17 = vsubps_avx(auVar103,auVar201);
  local_4c0._0_4_ = auVar239._0_4_ + (float)local_680._0_4_;
  local_4c0._4_4_ = auVar239._4_4_ + (float)local_680._4_4_;
  fStack_4b8 = auVar239._8_4_ + fStack_678;
  fStack_4b4 = auVar239._12_4_ + fStack_674;
  auVar200 = vshufps_avx(auVar137,auVar137,0xff);
  auVar120._0_4_ = fVar193 * auVar200._0_4_;
  auVar120._4_4_ = fVar153 * auVar200._4_4_;
  auVar120._8_4_ = fVar173 * auVar200._8_4_;
  auVar120._12_4_ = fVar194 * auVar200._12_4_;
  _local_4d0 = vsubps_avx(auVar137,auVar120);
  auVar16 = vshufps_avx(auVar81,auVar81,0xff);
  auVar97._0_4_ =
       fVar193 * auVar16._0_4_ + auVar200._0_4_ * auVar265._0_4_ * auVar82._0_4_ * auVar104._0_4_;
  auVar97._4_4_ =
       fVar153 * auVar16._4_4_ + auVar200._4_4_ * auVar265._4_4_ * auVar82._4_4_ * auVar104._4_4_;
  auVar97._8_4_ =
       fVar173 * auVar16._8_4_ + auVar200._8_4_ * auVar265._8_4_ * auVar82._8_4_ * auVar104._8_4_;
  auVar97._12_4_ =
       fVar194 * auVar16._12_4_ +
       auVar200._12_4_ * auVar265._12_4_ * auVar82._12_4_ * auVar104._12_4_;
  auVar265 = vsubps_avx(auVar81,auVar97);
  fVar117 = auVar137._0_4_ + auVar120._0_4_;
  fVar315 = auVar137._4_4_ + auVar120._4_4_;
  fVar259 = auVar137._8_4_ + auVar120._8_4_;
  fVar261 = auVar137._12_4_ + auVar120._12_4_;
  local_4e0._0_4_ = local_4b0._0_4_ + auVar17._0_4_ * 0.33333334;
  local_4e0._4_4_ = local_4b0._4_4_ + auVar17._4_4_ * 0.33333334;
  fStack_4d8 = local_4b0._8_4_ + auVar17._8_4_ * 0.33333334;
  fStack_4d4 = local_4b0._12_4_ + auVar17._12_4_ * 0.33333334;
  local_360 = vsubps_avx(_local_4b0,auVar191);
  auVar200 = vmovsldup_avx(local_360);
  auVar104 = vmovshdup_avx(local_360);
  auVar16 = vshufps_avx(local_360,local_360,0xaa);
  fVar133 = pre->ray_space[k].vx.field_0.m128[0];
  fVar155 = pre->ray_space[k].vx.field_0.m128[1];
  fVar175 = pre->ray_space[k].vx.field_0.m128[2];
  fVar152 = pre->ray_space[k].vx.field_0.m128[3];
  fVar172 = pre->ray_space[k].vy.field_0.m128[0];
  fVar193 = pre->ray_space[k].vy.field_0.m128[1];
  fVar153 = pre->ray_space[k].vy.field_0.m128[2];
  fVar173 = pre->ray_space[k].vy.field_0.m128[3];
  fVar194 = pre->ray_space[k].vz.field_0.m128[0];
  fVar154 = pre->ray_space[k].vz.field_0.m128[1];
  fVar174 = pre->ray_space[k].vz.field_0.m128[2];
  fVar195 = pre->ray_space[k].vz.field_0.m128[3];
  auVar277._0_4_ = fVar133 * auVar200._0_4_ + auVar16._0_4_ * fVar194 + fVar172 * auVar104._0_4_;
  auVar277._4_4_ = fVar155 * auVar200._4_4_ + auVar16._4_4_ * fVar154 + fVar193 * auVar104._4_4_;
  auVar277._8_4_ = fVar175 * auVar200._8_4_ + auVar16._8_4_ * fVar174 + fVar153 * auVar104._8_4_;
  auVar277._12_4_ = fVar152 * auVar200._12_4_ + auVar16._12_4_ * fVar195 + fVar173 * auVar104._12_4_
  ;
  local_370 = vsubps_avx(_local_4e0,auVar191);
  auVar16 = vshufps_avx(local_370,local_370,0xaa);
  auVar104 = vmovshdup_avx(local_370);
  auVar200 = vmovsldup_avx(local_370);
  fVar95 = auVar200._0_4_ * fVar133 + auVar104._0_4_ * fVar172 + fVar194 * auVar16._0_4_;
  fVar116 = auVar200._4_4_ * fVar155 + auVar104._4_4_ * fVar193 + fVar154 * auVar16._4_4_;
  local_6b0._4_4_ = fVar116;
  local_6b0._0_4_ = fVar95;
  fStack_6a8 = auVar200._8_4_ * fVar175 + auVar104._8_4_ * fVar153 + fVar174 * auVar16._8_4_;
  fStack_6a4 = auVar200._12_4_ * fVar152 + auVar104._12_4_ * fVar173 + fVar195 * auVar16._12_4_;
  auVar183._0_4_ = auVar265._0_4_ * 0.33333334;
  auVar183._4_4_ = auVar265._4_4_ * 0.33333334;
  auVar183._8_4_ = auVar265._8_4_ * 0.33333334;
  auVar183._12_4_ = auVar265._12_4_ * 0.33333334;
  _local_4f0 = vsubps_avx(_local_4d0,auVar183);
  local_380 = vsubps_avx(_local_4f0,auVar191);
  auVar16 = vshufps_avx(local_380,local_380,0xaa);
  auVar104 = vmovshdup_avx(local_380);
  auVar200 = vmovsldup_avx(local_380);
  auVar306._0_8_ =
       CONCAT44(auVar200._4_4_ * fVar155 + auVar104._4_4_ * fVar193 + fVar154 * auVar16._4_4_,
                auVar200._0_4_ * fVar133 + auVar104._0_4_ * fVar172 + fVar194 * auVar16._0_4_);
  auVar306._8_4_ = auVar200._8_4_ * fVar175 + auVar104._8_4_ * fVar153 + fVar174 * auVar16._8_4_;
  auVar306._12_4_ = auVar200._12_4_ * fVar152 + auVar104._12_4_ * fVar173 + fVar195 * auVar16._12_4_
  ;
  local_390 = vsubps_avx(_local_4d0,auVar191);
  auVar16 = vshufps_avx(local_390,local_390,0xaa);
  auVar104 = vmovshdup_avx(local_390);
  auVar200 = vmovsldup_avx(local_390);
  auVar294._0_8_ =
       CONCAT44(auVar200._4_4_ * fVar155 + auVar104._4_4_ * fVar193 + auVar16._4_4_ * fVar154,
                auVar200._0_4_ * fVar133 + auVar104._0_4_ * fVar172 + auVar16._0_4_ * fVar194);
  auVar294._8_4_ = auVar200._8_4_ * fVar175 + auVar104._8_4_ * fVar153 + auVar16._8_4_ * fVar174;
  auVar294._12_4_ = auVar200._12_4_ * fVar152 + auVar104._12_4_ * fVar173 + auVar16._12_4_ * fVar195
  ;
  local_3a0 = vsubps_avx(_local_4c0,auVar191);
  auVar16 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar104 = vmovshdup_avx(local_3a0);
  auVar200 = vmovsldup_avx(local_3a0);
  auVar252._0_4_ = auVar200._0_4_ * fVar133 + auVar104._0_4_ * fVar172 + auVar16._0_4_ * fVar194;
  auVar252._4_4_ = auVar200._4_4_ * fVar155 + auVar104._4_4_ * fVar193 + auVar16._4_4_ * fVar154;
  auVar252._8_4_ = auVar200._8_4_ * fVar175 + auVar104._8_4_ * fVar153 + auVar16._8_4_ * fVar174;
  auVar252._12_4_ = auVar200._12_4_ * fVar152 + auVar104._12_4_ * fVar173 + auVar16._12_4_ * fVar195
  ;
  local_500._0_4_ = (float)local_4c0._0_4_ + (fVar249 + auVar201._0_4_) * 0.33333334;
  local_500._4_4_ = (float)local_4c0._4_4_ + (fVar313 + auVar201._4_4_) * 0.33333334;
  fStack_4f8 = fStack_4b8 + (fVar250 + auVar201._8_4_) * 0.33333334;
  fStack_4f4 = fStack_4b4 + (fVar260 + auVar201._12_4_) * 0.33333334;
  local_3b0 = vsubps_avx(_local_500,auVar191);
  auVar16 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar104 = vmovshdup_avx(local_3b0);
  auVar200 = vmovsldup_avx(local_3b0);
  auVar224._0_4_ = auVar200._0_4_ * fVar133 + auVar104._0_4_ * fVar172 + auVar16._0_4_ * fVar194;
  auVar224._4_4_ = auVar200._4_4_ * fVar155 + auVar104._4_4_ * fVar193 + auVar16._4_4_ * fVar154;
  auVar224._8_4_ = auVar200._8_4_ * fVar175 + auVar104._8_4_ * fVar153 + auVar16._8_4_ * fVar174;
  auVar224._12_4_ = auVar200._12_4_ * fVar152 + auVar104._12_4_ * fVar173 + auVar16._12_4_ * fVar195
  ;
  auVar214._0_4_ = (fVar262 + auVar97._0_4_) * 0.33333334;
  auVar214._4_4_ = (fVar271 + auVar97._4_4_) * 0.33333334;
  auVar214._8_4_ = (fVar272 + auVar97._8_4_) * 0.33333334;
  auVar214._12_4_ = (fVar273 + auVar97._12_4_) * 0.33333334;
  auVar64._4_4_ = fVar315;
  auVar64._0_4_ = fVar117;
  auVar64._8_4_ = fVar259;
  auVar64._12_4_ = fVar261;
  _local_400 = vsubps_avx(auVar64,auVar214);
  local_3c0 = vsubps_avx(_local_400,auVar191);
  auVar16 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar104 = vmovshdup_avx(local_3c0);
  auVar200 = vmovsldup_avx(local_3c0);
  auVar98._0_4_ = auVar200._0_4_ * fVar133 + auVar104._0_4_ * fVar172 + fVar194 * auVar16._0_4_;
  auVar98._4_4_ = auVar200._4_4_ * fVar155 + auVar104._4_4_ * fVar193 + fVar154 * auVar16._4_4_;
  auVar98._8_4_ = auVar200._8_4_ * fVar175 + auVar104._8_4_ * fVar153 + fVar174 * auVar16._8_4_;
  auVar98._12_4_ = auVar200._12_4_ * fVar152 + auVar104._12_4_ * fVar173 + fVar195 * auVar16._12_4_;
  local_3d0 = vsubps_avx(auVar64,auVar191);
  auVar191 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar104 = vmovshdup_avx(local_3d0);
  auVar200 = vmovsldup_avx(local_3d0);
  auVar84._0_4_ = fVar133 * auVar200._0_4_ + fVar172 * auVar104._0_4_ + fVar194 * auVar191._0_4_;
  auVar84._4_4_ = fVar155 * auVar200._4_4_ + fVar193 * auVar104._4_4_ + fVar154 * auVar191._4_4_;
  auVar84._8_4_ = fVar175 * auVar200._8_4_ + fVar153 * auVar104._8_4_ + fVar174 * auVar191._8_4_;
  auVar84._12_4_ = fVar152 * auVar200._12_4_ + fVar173 * auVar104._12_4_ + fVar195 * auVar191._12_4_
  ;
  auVar16 = vmovlhps_avx(auVar277,auVar252);
  auVar265 = vmovlhps_avx(_local_6b0,auVar224);
  auVar17 = vmovlhps_avx(auVar306,auVar98);
  auVar82 = vmovlhps_avx(auVar294,auVar84);
  auVar104 = vminps_avx(auVar16,auVar265);
  auVar200 = vminps_avx(auVar17,auVar82);
  auVar191 = vminps_avx(auVar104,auVar200);
  auVar104 = vmaxps_avx(auVar16,auVar265);
  auVar200 = vmaxps_avx(auVar17,auVar82);
  auVar104 = vmaxps_avx(auVar104,auVar200);
  auVar200 = vshufpd_avx(auVar191,auVar191,3);
  auVar191 = vminps_avx(auVar191,auVar200);
  auVar200 = vshufpd_avx(auVar104,auVar104,3);
  auVar200 = vmaxps_avx(auVar104,auVar200);
  auVar202._8_4_ = 0x7fffffff;
  auVar202._0_8_ = 0x7fffffff7fffffff;
  auVar202._12_4_ = 0x7fffffff;
  auVar104 = vandps_avx(auVar191,auVar202);
  auVar200 = vandps_avx(auVar200,auVar202);
  auVar104 = vmaxps_avx(auVar104,auVar200);
  auVar200 = vmovshdup_avx(auVar104);
  auVar104 = vmaxss_avx(auVar200,auVar104);
  fVar155 = auVar104._0_4_ * 9.536743e-07;
  register0x00001588 = auVar306._0_8_;
  local_490 = auVar306._0_8_;
  register0x00001548 = auVar294._0_8_;
  local_4a0 = auVar294._0_8_;
  auVar104 = vshufps_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),0);
  local_280._16_16_ = auVar104;
  local_280._0_16_ = auVar104;
  auVar85._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
  auVar85._8_4_ = auVar104._8_4_ ^ 0x80000000;
  auVar85._12_4_ = auVar104._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar85;
  local_2a0._0_16_ = auVar85;
  auVar104 = vshufps_avx(ZEXT416(uVar71),ZEXT416(uVar71),0);
  local_2c0._16_16_ = auVar104;
  local_2c0._0_16_ = auVar104;
  auVar104 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar73 * 4 + 6)),0);
  local_2e0._16_16_ = auVar104;
  local_2e0._0_16_ = auVar104;
  bVar70 = false;
  uVar78 = 0;
  fVar133 = *(float *)(ray + k * 4 + 0x60);
  _local_330 = vsubps_avx(auVar265,auVar16);
  _local_340 = vsubps_avx(auVar17,auVar265);
  _local_350 = vsubps_avx(auVar82,auVar17);
  _local_410 = vsubps_avx(_local_4c0,_local_4b0);
  _local_420 = vsubps_avx(_local_500,_local_4e0);
  _local_430 = vsubps_avx(_local_400,_local_4f0);
  auVar65._4_4_ = fVar315;
  auVar65._0_4_ = fVar117;
  auVar65._8_4_ = fVar259;
  auVar65._12_4_ = fVar261;
  _local_440 = vsubps_avx(auVar65,_local_4d0);
  _local_6b0 = ZEXT816(0x3f80000000000000);
  local_3e0 = _local_6b0;
  do {
    auVar104 = vshufps_avx(_local_6b0,_local_6b0,0x50);
    auVar317._8_4_ = 0x3f800000;
    auVar317._0_8_ = &DAT_3f8000003f800000;
    auVar317._12_4_ = 0x3f800000;
    auVar320._16_4_ = 0x3f800000;
    auVar320._0_16_ = auVar317;
    auVar320._20_4_ = 0x3f800000;
    auVar320._24_4_ = 0x3f800000;
    auVar320._28_4_ = 0x3f800000;
    auVar200 = vsubps_avx(auVar317,auVar104);
    fVar175 = auVar104._0_4_;
    fVar172 = auVar104._4_4_;
    fVar153 = auVar104._8_4_;
    fVar194 = auVar104._12_4_;
    fVar152 = auVar200._0_4_;
    fVar193 = auVar200._4_4_;
    fVar173 = auVar200._8_4_;
    fVar154 = auVar200._12_4_;
    auVar121._0_4_ = auVar252._0_4_ * fVar175 + auVar277._0_4_ * fVar152;
    auVar121._4_4_ = auVar252._4_4_ * fVar172 + auVar277._4_4_ * fVar193;
    auVar121._8_4_ = auVar252._0_4_ * fVar153 + auVar277._0_4_ * fVar173;
    auVar121._12_4_ = auVar252._4_4_ * fVar194 + auVar277._4_4_ * fVar154;
    auVar99._0_4_ = auVar224._0_4_ * fVar175 + fVar95 * fVar152;
    auVar99._4_4_ = auVar224._4_4_ * fVar172 + fVar116 * fVar193;
    auVar99._8_4_ = auVar224._0_4_ * fVar153 + fVar95 * fVar173;
    auVar99._12_4_ = auVar224._4_4_ * fVar194 + fVar116 * fVar154;
    auVar161._0_4_ = auVar98._0_4_ * fVar175 + local_490._0_4_ * fVar152;
    auVar161._4_4_ = auVar98._4_4_ * fVar172 + local_490._4_4_ * fVar193;
    auVar161._8_4_ = auVar98._0_4_ * fVar153 + local_490._8_4_ * fVar173;
    auVar161._12_4_ = auVar98._4_4_ * fVar194 + local_490._12_4_ * fVar154;
    auVar138._0_4_ = auVar84._0_4_ * fVar175 + local_4a0._0_4_ * fVar152;
    auVar138._4_4_ = auVar84._4_4_ * fVar172 + local_4a0._4_4_ * fVar193;
    auVar138._8_4_ = auVar84._0_4_ * fVar153 + local_4a0._8_4_ * fVar173;
    auVar138._12_4_ = auVar84._4_4_ * fVar194 + local_4a0._12_4_ * fVar154;
    auVar104 = vmovshdup_avx(local_3e0);
    auVar200 = vshufps_avx(local_3e0,local_3e0,0);
    auVar232._16_16_ = auVar200;
    auVar232._0_16_ = auVar200;
    auVar191 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar90._16_16_ = auVar191;
    auVar90._0_16_ = auVar191;
    auVar89 = vsubps_avx(auVar90,auVar232);
    auVar191 = vshufps_avx(auVar121,auVar121,0);
    auVar83 = vshufps_avx(auVar121,auVar121,0x55);
    auVar103 = vshufps_avx(auVar99,auVar99,0);
    auVar81 = vshufps_avx(auVar99,auVar99,0x55);
    auVar86 = vshufps_avx(auVar161,auVar161,0);
    auVar122 = vshufps_avx(auVar161,auVar161,0x55);
    auVar96 = vshufps_avx(auVar138,auVar138,0);
    auVar118 = vshufps_avx(auVar138,auVar138,0x55);
    auVar104 = ZEXT416((uint)((auVar104._0_4_ - local_3e0._0_4_) * 0.04761905));
    auVar104 = vshufps_avx(auVar104,auVar104,0);
    auVar248._0_4_ = auVar200._0_4_ + auVar89._0_4_ * 0.0;
    auVar248._4_4_ = auVar200._4_4_ + auVar89._4_4_ * 0.14285715;
    auVar248._8_4_ = auVar200._8_4_ + auVar89._8_4_ * 0.2857143;
    auVar248._12_4_ = auVar200._12_4_ + auVar89._12_4_ * 0.42857146;
    auVar248._16_4_ = auVar200._0_4_ + auVar89._16_4_ * 0.5714286;
    auVar248._20_4_ = auVar200._4_4_ + auVar89._20_4_ * 0.71428573;
    auVar248._24_4_ = auVar200._8_4_ + auVar89._24_4_ * 0.8571429;
    auVar248._28_4_ = auVar200._12_4_ + auVar89._28_4_;
    auVar20 = vsubps_avx(auVar320,auVar248);
    fVar260 = auVar103._0_4_;
    fVar271 = auVar103._4_4_;
    fVar281 = auVar103._8_4_;
    fVar292 = auVar103._12_4_;
    fVar175 = auVar20._0_4_;
    fVar153 = auVar20._4_4_;
    fVar174 = auVar20._8_4_;
    fVar250 = auVar20._12_4_;
    fVar302 = auVar191._12_4_;
    fVar272 = auVar20._16_4_;
    fVar273 = auVar20._20_4_;
    fVar274 = auVar20._24_4_;
    fVar311 = auVar81._0_4_;
    fVar208 = auVar81._4_4_;
    fVar209 = auVar81._8_4_;
    fVar291 = auVar81._12_4_;
    local_5e0 = auVar83._0_4_;
    fStack_5dc = auVar83._4_4_;
    fStack_5d8 = auVar83._8_4_;
    fStack_5d4 = auVar83._12_4_;
    fVar152 = auVar86._0_4_;
    fVar193 = auVar86._4_4_;
    fVar194 = auVar86._8_4_;
    fVar195 = auVar86._12_4_;
    fVar262 = auVar248._0_4_ * fVar152 + fVar260 * fVar175;
    fVar279 = auVar248._4_4_ * fVar193 + fVar271 * fVar153;
    fVar283 = auVar248._8_4_ * fVar194 + fVar281 * fVar174;
    fVar299 = auVar248._12_4_ * fVar195 + fVar292 * fVar250;
    fVar300 = auVar248._16_4_ * fVar152 + fVar260 * fVar272;
    fVar301 = auVar248._20_4_ * fVar193 + fVar271 * fVar273;
    fVar304 = auVar248._24_4_ * fVar194 + fVar281 * fVar274;
    fVar172 = auVar122._0_4_;
    fVar173 = auVar122._4_4_;
    fVar154 = auVar122._8_4_;
    fVar249 = auVar122._12_4_;
    fVar275 = auVar248._0_4_ * fVar172 + fVar311 * fVar175;
    fVar280 = auVar248._4_4_ * fVar173 + fVar208 * fVar153;
    fVar282 = auVar248._8_4_ * fVar154 + fVar209 * fVar174;
    fVar284 = auVar248._12_4_ * fVar249 + fVar291 * fVar250;
    fVar285 = auVar248._16_4_ * fVar172 + fVar311 * fVar272;
    fVar287 = auVar248._20_4_ * fVar173 + fVar208 * fVar273;
    fVar289 = auVar248._24_4_ * fVar154 + fVar209 * fVar274;
    auVar200 = vshufps_avx(auVar121,auVar121,0xaa);
    auVar83 = vshufps_avx(auVar121,auVar121,0xff);
    fVar313 = fVar195 + 0.0;
    auVar103 = vshufps_avx(auVar99,auVar99,0xaa);
    auVar81 = vshufps_avx(auVar99,auVar99,0xff);
    auVar91._0_4_ =
         fVar175 * (fVar260 * auVar248._0_4_ + auVar191._0_4_ * fVar175) + auVar248._0_4_ * fVar262;
    auVar91._4_4_ =
         fVar153 * (fVar271 * auVar248._4_4_ + auVar191._4_4_ * fVar153) + auVar248._4_4_ * fVar279;
    auVar91._8_4_ =
         fVar174 * (fVar281 * auVar248._8_4_ + auVar191._8_4_ * fVar174) + auVar248._8_4_ * fVar283;
    auVar91._12_4_ =
         fVar250 * (fVar292 * auVar248._12_4_ + fVar302 * fVar250) + auVar248._12_4_ * fVar299;
    auVar91._16_4_ =
         fVar272 * (fVar260 * auVar248._16_4_ + auVar191._0_4_ * fVar272) +
         auVar248._16_4_ * fVar300;
    auVar91._20_4_ =
         fVar273 * (fVar271 * auVar248._20_4_ + auVar191._4_4_ * fVar273) +
         auVar248._20_4_ * fVar301;
    auVar91._24_4_ =
         fVar274 * (fVar281 * auVar248._24_4_ + auVar191._8_4_ * fVar274) +
         auVar248._24_4_ * fVar304;
    auVar91._28_4_ = fVar302 + 1.0 + fVar249;
    auVar148._0_4_ =
         fVar175 * (fVar311 * auVar248._0_4_ + fVar175 * local_5e0) + auVar248._0_4_ * fVar275;
    auVar148._4_4_ =
         fVar153 * (fVar208 * auVar248._4_4_ + fVar153 * fStack_5dc) + auVar248._4_4_ * fVar280;
    auVar148._8_4_ =
         fVar174 * (fVar209 * auVar248._8_4_ + fVar174 * fStack_5d8) + auVar248._8_4_ * fVar282;
    auVar148._12_4_ =
         fVar250 * (fVar291 * auVar248._12_4_ + fVar250 * fStack_5d4) + auVar248._12_4_ * fVar284;
    auVar148._16_4_ =
         fVar272 * (fVar311 * auVar248._16_4_ + fVar272 * local_5e0) + auVar248._16_4_ * fVar285;
    auVar148._20_4_ =
         fVar273 * (fVar208 * auVar248._20_4_ + fVar273 * fStack_5dc) + auVar248._20_4_ * fVar287;
    auVar148._24_4_ =
         fVar274 * (fVar209 * auVar248._24_4_ + fVar274 * fStack_5d8) + auVar248._24_4_ * fVar289;
    auVar148._28_4_ = fVar302 + 1.0 + fVar249;
    auVar169._0_4_ =
         fVar175 * fVar262 + auVar248._0_4_ * (auVar96._0_4_ * auVar248._0_4_ + fVar175 * fVar152);
    auVar169._4_4_ =
         fVar153 * fVar279 + auVar248._4_4_ * (auVar96._4_4_ * auVar248._4_4_ + fVar153 * fVar193);
    auVar169._8_4_ =
         fVar174 * fVar283 + auVar248._8_4_ * (auVar96._8_4_ * auVar248._8_4_ + fVar174 * fVar194);
    auVar169._12_4_ =
         fVar250 * fVar299 +
         auVar248._12_4_ * (auVar96._12_4_ * auVar248._12_4_ + fVar250 * fVar195);
    auVar169._16_4_ =
         fVar272 * fVar300 + auVar248._16_4_ * (auVar96._0_4_ * auVar248._16_4_ + fVar272 * fVar152)
    ;
    auVar169._20_4_ =
         fVar273 * fVar301 + auVar248._20_4_ * (auVar96._4_4_ * auVar248._20_4_ + fVar273 * fVar193)
    ;
    auVar169._24_4_ =
         fVar274 * fVar304 + auVar248._24_4_ * (auVar96._8_4_ * auVar248._24_4_ + fVar274 * fVar194)
    ;
    auVar169._28_4_ = fVar249 + fVar313;
    auVar258._0_4_ =
         fVar175 * fVar275 + auVar248._0_4_ * (auVar118._0_4_ * auVar248._0_4_ + fVar175 * fVar172);
    auVar258._4_4_ =
         fVar153 * fVar280 + auVar248._4_4_ * (auVar118._4_4_ * auVar248._4_4_ + fVar153 * fVar173);
    auVar258._8_4_ =
         fVar174 * fVar282 + auVar248._8_4_ * (auVar118._8_4_ * auVar248._8_4_ + fVar174 * fVar154);
    auVar258._12_4_ =
         fVar250 * fVar284 +
         auVar248._12_4_ * (auVar118._12_4_ * auVar248._12_4_ + fVar250 * fVar249);
    auVar258._16_4_ =
         fVar272 * fVar285 +
         auVar248._16_4_ * (auVar118._0_4_ * auVar248._16_4_ + fVar272 * fVar172);
    auVar258._20_4_ =
         fVar273 * fVar287 +
         auVar248._20_4_ * (auVar118._4_4_ * auVar248._20_4_ + fVar273 * fVar173);
    auVar258._24_4_ =
         fVar274 * fVar289 +
         auVar248._24_4_ * (auVar118._8_4_ * auVar248._24_4_ + fVar274 * fVar154);
    auVar258._28_4_ = fVar313 + fVar249 + 0.0;
    local_1c0._0_4_ = fVar175 * auVar91._0_4_ + auVar248._0_4_ * auVar169._0_4_;
    local_1c0._4_4_ = fVar153 * auVar91._4_4_ + auVar248._4_4_ * auVar169._4_4_;
    local_1c0._8_4_ = fVar174 * auVar91._8_4_ + auVar248._8_4_ * auVar169._8_4_;
    local_1c0._12_4_ = fVar250 * auVar91._12_4_ + auVar248._12_4_ * auVar169._12_4_;
    local_1c0._16_4_ = fVar272 * auVar91._16_4_ + auVar248._16_4_ * auVar169._16_4_;
    local_1c0._20_4_ = fVar273 * auVar91._20_4_ + auVar248._20_4_ * auVar169._20_4_;
    local_1c0._24_4_ = fVar274 * auVar91._24_4_ + auVar248._24_4_ * auVar169._24_4_;
    local_1c0._28_4_ = fVar302 + fVar292 + fVar249 + 0.0;
    local_1e0._0_4_ = fVar175 * auVar148._0_4_ + auVar248._0_4_ * auVar258._0_4_;
    local_1e0._4_4_ = fVar153 * auVar148._4_4_ + auVar248._4_4_ * auVar258._4_4_;
    local_1e0._8_4_ = fVar174 * auVar148._8_4_ + auVar248._8_4_ * auVar258._8_4_;
    local_1e0._12_4_ = fVar250 * auVar148._12_4_ + auVar248._12_4_ * auVar258._12_4_;
    local_1e0._16_4_ = fVar272 * auVar148._16_4_ + auVar248._16_4_ * auVar258._16_4_;
    local_1e0._20_4_ = fVar273 * auVar148._20_4_ + auVar248._20_4_ * auVar258._20_4_;
    local_1e0._24_4_ = fVar274 * auVar148._24_4_ + auVar248._24_4_ * auVar258._24_4_;
    local_1e0._28_4_ = fVar302 + fVar292 + fVar313;
    auVar21 = vsubps_avx(auVar169,auVar91);
    auVar89 = vsubps_avx(auVar258,auVar148);
    local_640 = auVar104._0_4_;
    fStack_63c = auVar104._4_4_;
    fStack_638 = auVar104._8_4_;
    fStack_634 = auVar104._12_4_;
    local_220 = local_640 * auVar21._0_4_ * 3.0;
    fStack_21c = fStack_63c * auVar21._4_4_ * 3.0;
    auVar22._4_4_ = fStack_21c;
    auVar22._0_4_ = local_220;
    fStack_218 = fStack_638 * auVar21._8_4_ * 3.0;
    auVar22._8_4_ = fStack_218;
    fStack_214 = fStack_634 * auVar21._12_4_ * 3.0;
    auVar22._12_4_ = fStack_214;
    fStack_210 = local_640 * auVar21._16_4_ * 3.0;
    auVar22._16_4_ = fStack_210;
    fStack_20c = fStack_63c * auVar21._20_4_ * 3.0;
    auVar22._20_4_ = fStack_20c;
    fStack_208 = fStack_638 * auVar21._24_4_ * 3.0;
    auVar22._24_4_ = fStack_208;
    auVar22._28_4_ = auVar21._28_4_;
    fVar279 = local_640 * auVar89._0_4_ * 3.0;
    fVar281 = fStack_63c * auVar89._4_4_ * 3.0;
    auVar23._4_4_ = fVar281;
    auVar23._0_4_ = fVar279;
    fVar283 = fStack_638 * auVar89._8_4_ * 3.0;
    auVar23._8_4_ = fVar283;
    fVar292 = fStack_634 * auVar89._12_4_ * 3.0;
    auVar23._12_4_ = fVar292;
    fVar299 = local_640 * auVar89._16_4_ * 3.0;
    auVar23._16_4_ = fVar299;
    fVar300 = fStack_63c * auVar89._20_4_ * 3.0;
    auVar23._20_4_ = fVar300;
    fVar301 = fStack_638 * auVar89._24_4_ * 3.0;
    auVar23._24_4_ = fVar301;
    auVar23._28_4_ = auVar169._28_4_;
    auVar22 = vsubps_avx(local_1c0,auVar22);
    auVar89 = vperm2f128_avx(auVar22,auVar22,1);
    auVar89 = vshufps_avx(auVar89,auVar22,0x30);
    auVar89 = vshufps_avx(auVar22,auVar89,0x29);
    auVar23 = vsubps_avx(local_1e0,auVar23);
    auVar22 = vperm2f128_avx(auVar23,auVar23,1);
    auVar22 = vshufps_avx(auVar22,auVar23,0x30);
    auVar90 = vshufps_avx(auVar23,auVar22,0x29);
    fVar305 = auVar103._0_4_;
    fVar312 = auVar103._4_4_;
    fVar314 = auVar103._8_4_;
    fVar152 = auVar81._0_4_;
    fVar173 = auVar81._4_4_;
    fVar195 = auVar81._8_4_;
    fVar260 = auVar81._12_4_;
    fVar303 = auVar83._12_4_;
    auVar104 = vshufps_avx(auVar161,auVar161,0xaa);
    fVar172 = auVar104._0_4_;
    fVar194 = auVar104._4_4_;
    fVar249 = auVar104._8_4_;
    fVar262 = auVar104._12_4_;
    fVar284 = auVar248._0_4_ * fVar172 + fVar305 * fVar175;
    fVar285 = auVar248._4_4_ * fVar194 + fVar312 * fVar153;
    fVar287 = auVar248._8_4_ * fVar249 + fVar314 * fVar174;
    fVar289 = auVar248._12_4_ * fVar262 + auVar103._12_4_ * fVar250;
    fVar286 = auVar248._16_4_ * fVar172 + fVar305 * fVar272;
    fVar288 = auVar248._20_4_ * fVar194 + fVar312 * fVar273;
    fVar290 = auVar248._24_4_ * fVar249 + fVar314 * fVar274;
    fVar291 = fVar303 + fVar302 + fVar291;
    auVar104 = vshufps_avx(auVar161,auVar161,0xff);
    fVar193 = auVar104._0_4_;
    fVar154 = auVar104._4_4_;
    fVar313 = auVar104._8_4_;
    fVar271 = auVar104._12_4_;
    fVar304 = auVar248._0_4_ * fVar193 + fVar175 * fVar152;
    fVar311 = auVar248._4_4_ * fVar154 + fVar153 * fVar173;
    fVar275 = auVar248._8_4_ * fVar313 + fVar174 * fVar195;
    fVar208 = auVar248._12_4_ * fVar271 + fVar250 * fVar260;
    fVar280 = auVar248._16_4_ * fVar193 + fVar272 * fVar152;
    fVar209 = auVar248._20_4_ * fVar154 + fVar273 * fVar173;
    fVar282 = auVar248._24_4_ * fVar313 + fVar274 * fVar195;
    auVar104 = vshufps_avx(auVar138,auVar138,0xaa);
    auVar191 = vshufps_avx(auVar138,auVar138,0xff);
    fVar302 = auVar191._12_4_;
    auVar92._0_4_ =
         auVar248._0_4_ * fVar284 + fVar175 * (fVar305 * auVar248._0_4_ + auVar200._0_4_ * fVar175);
    auVar92._4_4_ =
         auVar248._4_4_ * fVar285 + fVar153 * (fVar312 * auVar248._4_4_ + auVar200._4_4_ * fVar153);
    auVar92._8_4_ =
         auVar248._8_4_ * fVar287 + fVar174 * (fVar314 * auVar248._8_4_ + auVar200._8_4_ * fVar174);
    auVar92._12_4_ =
         auVar248._12_4_ * fVar289 +
         fVar250 * (auVar103._12_4_ * auVar248._12_4_ + auVar200._12_4_ * fVar250);
    auVar92._16_4_ =
         auVar248._16_4_ * fVar286 +
         fVar272 * (fVar305 * auVar248._16_4_ + auVar200._0_4_ * fVar272);
    auVar92._20_4_ =
         auVar248._20_4_ * fVar288 +
         fVar273 * (fVar312 * auVar248._20_4_ + auVar200._4_4_ * fVar273);
    auVar92._24_4_ =
         auVar248._24_4_ * fVar290 +
         fVar274 * (fVar314 * auVar248._24_4_ + auVar200._8_4_ * fVar274);
    auVar92._28_4_ = fVar302 + auVar23._28_4_ + auVar22._28_4_;
    auVar298._0_4_ =
         auVar248._0_4_ * fVar304 + fVar175 * (auVar248._0_4_ * fVar152 + auVar83._0_4_ * fVar175);
    auVar298._4_4_ =
         auVar248._4_4_ * fVar311 + fVar153 * (auVar248._4_4_ * fVar173 + auVar83._4_4_ * fVar153);
    auVar298._8_4_ =
         auVar248._8_4_ * fVar275 + fVar174 * (auVar248._8_4_ * fVar195 + auVar83._8_4_ * fVar174);
    auVar298._12_4_ =
         auVar248._12_4_ * fVar208 + fVar250 * (auVar248._12_4_ * fVar260 + fVar303 * fVar250);
    auVar298._16_4_ =
         auVar248._16_4_ * fVar280 + fVar272 * (auVar248._16_4_ * fVar152 + auVar83._0_4_ * fVar272)
    ;
    auVar298._20_4_ =
         auVar248._20_4_ * fVar209 + fVar273 * (auVar248._20_4_ * fVar173 + auVar83._4_4_ * fVar273)
    ;
    auVar298._24_4_ =
         auVar248._24_4_ * fVar282 + fVar274 * (auVar248._24_4_ * fVar195 + auVar83._8_4_ * fVar274)
    ;
    auVar298._28_4_ = fVar302 + auVar22._28_4_ + auVar169._28_4_;
    auVar22 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar22 = vshufps_avx(auVar22,local_1c0,0x30);
    auVar91 = vshufps_avx(local_1c0,auVar22,0x29);
    auVar170._0_4_ =
         fVar175 * fVar284 + auVar248._0_4_ * (auVar104._0_4_ * auVar248._0_4_ + fVar175 * fVar172);
    auVar170._4_4_ =
         fVar153 * fVar285 + auVar248._4_4_ * (auVar104._4_4_ * auVar248._4_4_ + fVar153 * fVar194);
    auVar170._8_4_ =
         fVar174 * fVar287 + auVar248._8_4_ * (auVar104._8_4_ * auVar248._8_4_ + fVar174 * fVar249);
    auVar170._12_4_ =
         fVar250 * fVar289 +
         auVar248._12_4_ * (auVar104._12_4_ * auVar248._12_4_ + fVar250 * fVar262);
    auVar170._16_4_ =
         fVar272 * fVar286 +
         auVar248._16_4_ * (auVar104._0_4_ * auVar248._16_4_ + fVar272 * fVar172);
    auVar170._20_4_ =
         fVar273 * fVar288 +
         auVar248._20_4_ * (auVar104._4_4_ * auVar248._20_4_ + fVar273 * fVar194);
    auVar170._24_4_ =
         fVar274 * fVar290 +
         auVar248._24_4_ * (auVar104._8_4_ * auVar248._24_4_ + fVar274 * fVar249);
    auVar170._28_4_ = fVar291 + auVar104._12_4_ + fVar262;
    auVar207._0_4_ =
         fVar175 * fVar304 + auVar248._0_4_ * (auVar191._0_4_ * auVar248._0_4_ + fVar175 * fVar193);
    auVar207._4_4_ =
         fVar153 * fVar311 + auVar248._4_4_ * (auVar191._4_4_ * auVar248._4_4_ + fVar153 * fVar154);
    auVar207._8_4_ =
         fVar174 * fVar275 + auVar248._8_4_ * (auVar191._8_4_ * auVar248._8_4_ + fVar174 * fVar313);
    auVar207._12_4_ =
         fVar250 * fVar208 + auVar248._12_4_ * (fVar302 * auVar248._12_4_ + fVar250 * fVar271);
    auVar207._16_4_ =
         fVar272 * fVar280 +
         auVar248._16_4_ * (auVar191._0_4_ * auVar248._16_4_ + fVar272 * fVar193);
    auVar207._20_4_ =
         fVar273 * fVar209 +
         auVar248._20_4_ * (auVar191._4_4_ * auVar248._20_4_ + fVar273 * fVar154);
    auVar207._24_4_ =
         fVar274 * fVar282 +
         auVar248._24_4_ * (auVar191._8_4_ * auVar248._24_4_ + fVar274 * fVar313);
    auVar207._28_4_ = fVar303 + fVar260 + fVar302 + fVar271;
    auVar217._0_4_ = fVar175 * auVar92._0_4_ + auVar248._0_4_ * auVar170._0_4_;
    auVar217._4_4_ = fVar153 * auVar92._4_4_ + auVar248._4_4_ * auVar170._4_4_;
    auVar217._8_4_ = fVar174 * auVar92._8_4_ + auVar248._8_4_ * auVar170._8_4_;
    auVar217._12_4_ = fVar250 * auVar92._12_4_ + auVar248._12_4_ * auVar170._12_4_;
    auVar217._16_4_ = fVar272 * auVar92._16_4_ + auVar248._16_4_ * auVar170._16_4_;
    auVar217._20_4_ = fVar273 * auVar92._20_4_ + auVar248._20_4_ * auVar170._20_4_;
    auVar217._24_4_ = fVar274 * auVar92._24_4_ + auVar248._24_4_ * auVar170._24_4_;
    auVar217._28_4_ = fVar291 + fVar302 + fVar271;
    auVar233._0_4_ = fVar175 * auVar298._0_4_ + auVar248._0_4_ * auVar207._0_4_;
    auVar233._4_4_ = fVar153 * auVar298._4_4_ + auVar248._4_4_ * auVar207._4_4_;
    auVar233._8_4_ = fVar174 * auVar298._8_4_ + auVar248._8_4_ * auVar207._8_4_;
    auVar233._12_4_ = fVar250 * auVar298._12_4_ + auVar248._12_4_ * auVar207._12_4_;
    auVar233._16_4_ = fVar272 * auVar298._16_4_ + auVar248._16_4_ * auVar207._16_4_;
    auVar233._20_4_ = fVar273 * auVar298._20_4_ + auVar248._20_4_ * auVar207._20_4_;
    auVar233._24_4_ = fVar274 * auVar298._24_4_ + auVar248._24_4_ * auVar207._24_4_;
    auVar233._28_4_ = auVar20._28_4_ + auVar248._28_4_;
    auVar22 = vsubps_avx(auVar170,auVar92);
    auVar20 = vsubps_avx(auVar207,auVar298);
    local_240 = local_640 * auVar22._0_4_ * 3.0;
    fStack_23c = fStack_63c * auVar22._4_4_ * 3.0;
    auVar18._4_4_ = fStack_23c;
    auVar18._0_4_ = local_240;
    fStack_238 = fStack_638 * auVar22._8_4_ * 3.0;
    auVar18._8_4_ = fStack_238;
    fStack_234 = fStack_634 * auVar22._12_4_ * 3.0;
    auVar18._12_4_ = fStack_234;
    fStack_230 = local_640 * auVar22._16_4_ * 3.0;
    auVar18._16_4_ = fStack_230;
    fStack_22c = fStack_63c * auVar22._20_4_ * 3.0;
    auVar18._20_4_ = fStack_22c;
    fStack_228 = fStack_638 * auVar22._24_4_ * 3.0;
    auVar18._24_4_ = fStack_228;
    auVar18._28_4_ = auVar207._28_4_;
    local_260 = local_640 * auVar20._0_4_ * 3.0;
    fStack_25c = fStack_63c * auVar20._4_4_ * 3.0;
    auVar19._4_4_ = fStack_25c;
    auVar19._0_4_ = local_260;
    fStack_258 = fStack_638 * auVar20._8_4_ * 3.0;
    auVar19._8_4_ = fStack_258;
    fStack_254 = fStack_634 * auVar20._12_4_ * 3.0;
    auVar19._12_4_ = fStack_254;
    local_640 = local_640 * auVar20._16_4_ * 3.0;
    auVar19._16_4_ = local_640;
    fStack_63c = fStack_63c * auVar20._20_4_ * 3.0;
    auVar19._20_4_ = fStack_63c;
    fStack_638 = fStack_638 * auVar20._24_4_ * 3.0;
    auVar19._24_4_ = fStack_638;
    auVar19._28_4_ = fStack_634;
    auVar22 = vperm2f128_avx(auVar217,auVar217,1);
    auVar22 = vshufps_avx(auVar22,auVar217,0x30);
    auVar92 = vshufps_avx(auVar217,auVar22,0x29);
    auVar20 = vsubps_avx(auVar217,auVar18);
    auVar22 = vperm2f128_avx(auVar20,auVar20,1);
    auVar22 = vshufps_avx(auVar22,auVar20,0x30);
    auVar18 = vshufps_avx(auVar20,auVar22,0x29);
    auVar20 = vsubps_avx(auVar233,auVar19);
    auVar22 = vperm2f128_avx(auVar20,auVar20,1);
    auVar22 = vshufps_avx(auVar22,auVar20,0x30);
    auVar19 = vshufps_avx(auVar20,auVar22,0x29);
    auVar23 = vsubps_avx(auVar217,local_1c0);
    auVar24 = vsubps_avx(auVar92,auVar91);
    fVar175 = auVar24._0_4_ + auVar23._0_4_;
    fVar152 = auVar24._4_4_ + auVar23._4_4_;
    fVar172 = auVar24._8_4_ + auVar23._8_4_;
    fVar193 = auVar24._12_4_ + auVar23._12_4_;
    fVar153 = auVar24._16_4_ + auVar23._16_4_;
    fVar173 = auVar24._20_4_ + auVar23._20_4_;
    fVar194 = auVar24._24_4_ + auVar23._24_4_;
    auVar20 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar20 = vshufps_avx(auVar20,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar20,0x29);
    auVar20 = vperm2f128_avx(auVar233,auVar233,1);
    auVar20 = vshufps_avx(auVar20,auVar233,0x30);
    auVar148 = vshufps_avx(auVar233,auVar20,0x29);
    auVar20 = vsubps_avx(auVar233,local_1e0);
    auVar170 = vsubps_avx(auVar148,local_200);
    fVar154 = auVar20._0_4_ + auVar170._0_4_;
    fVar174 = auVar20._4_4_ + auVar170._4_4_;
    fVar195 = auVar20._8_4_ + auVar170._8_4_;
    fVar249 = auVar20._12_4_ + auVar170._12_4_;
    fVar313 = auVar20._16_4_ + auVar170._16_4_;
    fVar250 = auVar20._20_4_ + auVar170._20_4_;
    fVar260 = auVar20._24_4_ + auVar170._24_4_;
    fVar262 = auVar20._28_4_;
    auVar20._4_4_ = local_1e0._4_4_ * fVar152;
    auVar20._0_4_ = local_1e0._0_4_ * fVar175;
    auVar20._8_4_ = local_1e0._8_4_ * fVar172;
    auVar20._12_4_ = local_1e0._12_4_ * fVar193;
    auVar20._16_4_ = local_1e0._16_4_ * fVar153;
    auVar20._20_4_ = local_1e0._20_4_ * fVar173;
    auVar20._24_4_ = local_1e0._24_4_ * fVar194;
    auVar20._28_4_ = fVar262;
    auVar25._4_4_ = fVar174 * local_1c0._4_4_;
    auVar25._0_4_ = fVar154 * local_1c0._0_4_;
    auVar25._8_4_ = fVar195 * local_1c0._8_4_;
    auVar25._12_4_ = fVar249 * local_1c0._12_4_;
    auVar25._16_4_ = fVar313 * local_1c0._16_4_;
    auVar25._20_4_ = fVar250 * local_1c0._20_4_;
    auVar25._24_4_ = fVar260 * local_1c0._24_4_;
    auVar25._28_4_ = auVar22._28_4_;
    auVar20 = vsubps_avx(auVar20,auVar25);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar21._28_4_;
    fVar279 = local_1e0._0_4_ + fVar279;
    fVar281 = local_1e0._4_4_ + fVar281;
    fVar283 = local_1e0._8_4_ + fVar283;
    fVar292 = local_1e0._12_4_ + fVar292;
    fVar299 = local_1e0._16_4_ + fVar299;
    fVar300 = local_1e0._20_4_ + fVar300;
    fVar301 = local_1e0._24_4_ + fVar301;
    auVar21._4_4_ = fVar281 * fVar152;
    auVar21._0_4_ = fVar279 * fVar175;
    auVar21._8_4_ = fVar283 * fVar172;
    auVar21._12_4_ = fVar292 * fVar193;
    auVar21._16_4_ = fVar299 * fVar153;
    auVar21._20_4_ = fVar300 * fVar173;
    auVar21._24_4_ = fVar301 * fVar194;
    auVar21._28_4_ = fVar262;
    auVar26._4_4_ = fVar174 * fStack_21c;
    auVar26._0_4_ = fVar154 * local_220;
    auVar26._8_4_ = fVar195 * fStack_218;
    auVar26._12_4_ = fVar249 * fStack_214;
    auVar26._16_4_ = fVar313 * fStack_210;
    auVar26._20_4_ = fVar250 * fStack_20c;
    auVar26._24_4_ = fVar260 * fStack_208;
    auVar26._28_4_ = fStack_204;
    auVar21 = vsubps_avx(auVar21,auVar26);
    auVar27._4_4_ = auVar90._4_4_ * fVar152;
    auVar27._0_4_ = auVar90._0_4_ * fVar175;
    auVar27._8_4_ = auVar90._8_4_ * fVar172;
    auVar27._12_4_ = auVar90._12_4_ * fVar193;
    auVar27._16_4_ = auVar90._16_4_ * fVar153;
    auVar27._20_4_ = auVar90._20_4_ * fVar173;
    auVar27._24_4_ = auVar90._24_4_ * fVar194;
    auVar27._28_4_ = fVar262;
    local_5e0 = auVar89._0_4_;
    fStack_5dc = auVar89._4_4_;
    fStack_5d8 = auVar89._8_4_;
    fStack_5d4 = auVar89._12_4_;
    fStack_5d0 = auVar89._16_4_;
    fStack_5cc = auVar89._20_4_;
    fStack_5c8 = auVar89._24_4_;
    auVar28._4_4_ = fVar174 * fStack_5dc;
    auVar28._0_4_ = fVar154 * local_5e0;
    auVar28._8_4_ = fVar195 * fStack_5d8;
    auVar28._12_4_ = fVar249 * fStack_5d4;
    auVar28._16_4_ = fVar313 * fStack_5d0;
    auVar28._20_4_ = fVar250 * fStack_5cc;
    auVar28._24_4_ = fVar260 * fStack_5c8;
    auVar28._28_4_ = 0x40400000;
    auVar25 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = local_200._4_4_ * fVar152;
    auVar29._0_4_ = local_200._0_4_ * fVar175;
    auVar29._8_4_ = local_200._8_4_ * fVar172;
    auVar29._12_4_ = local_200._12_4_ * fVar193;
    auVar29._16_4_ = local_200._16_4_ * fVar153;
    auVar29._20_4_ = local_200._20_4_ * fVar173;
    auVar29._24_4_ = local_200._24_4_ * fVar194;
    auVar29._28_4_ = fVar262;
    auVar30._4_4_ = auVar91._4_4_ * fVar174;
    auVar30._0_4_ = auVar91._0_4_ * fVar154;
    auVar30._8_4_ = auVar91._8_4_ * fVar195;
    auVar30._12_4_ = auVar91._12_4_ * fVar249;
    auVar30._16_4_ = auVar91._16_4_ * fVar313;
    auVar30._20_4_ = auVar91._20_4_ * fVar250;
    auVar30._24_4_ = auVar91._24_4_ * fVar260;
    auVar30._28_4_ = local_200._28_4_;
    auVar26 = vsubps_avx(auVar29,auVar30);
    auVar31._4_4_ = auVar233._4_4_ * fVar152;
    auVar31._0_4_ = auVar233._0_4_ * fVar175;
    auVar31._8_4_ = auVar233._8_4_ * fVar172;
    auVar31._12_4_ = auVar233._12_4_ * fVar193;
    auVar31._16_4_ = auVar233._16_4_ * fVar153;
    auVar31._20_4_ = auVar233._20_4_ * fVar173;
    auVar31._24_4_ = auVar233._24_4_ * fVar194;
    auVar31._28_4_ = fVar262;
    auVar32._4_4_ = fVar174 * auVar217._4_4_;
    auVar32._0_4_ = fVar154 * auVar217._0_4_;
    auVar32._8_4_ = fVar195 * auVar217._8_4_;
    auVar32._12_4_ = fVar249 * auVar217._12_4_;
    auVar32._16_4_ = fVar313 * auVar217._16_4_;
    auVar32._20_4_ = fVar250 * auVar217._20_4_;
    auVar32._24_4_ = fVar260 * auVar217._24_4_;
    auVar32._28_4_ = auVar90._28_4_;
    auVar27 = vsubps_avx(auVar31,auVar32);
    local_240 = auVar217._0_4_ + local_240;
    fStack_23c = auVar217._4_4_ + fStack_23c;
    fStack_238 = auVar217._8_4_ + fStack_238;
    fStack_234 = auVar217._12_4_ + fStack_234;
    fStack_230 = auVar217._16_4_ + fStack_230;
    fStack_22c = auVar217._20_4_ + fStack_22c;
    fStack_228 = auVar217._24_4_ + fStack_228;
    fStack_224 = auVar217._28_4_ + auVar207._28_4_;
    local_260 = auVar233._0_4_ + local_260;
    fStack_25c = auVar233._4_4_ + fStack_25c;
    fStack_258 = auVar233._8_4_ + fStack_258;
    fStack_254 = auVar233._12_4_ + fStack_254;
    fStack_250 = auVar233._16_4_ + local_640;
    fStack_24c = auVar233._20_4_ + fStack_63c;
    fStack_248 = auVar233._24_4_ + fStack_638;
    fStack_244 = auVar233._28_4_ + fStack_634;
    auVar33._4_4_ = fStack_25c * fVar152;
    auVar33._0_4_ = local_260 * fVar175;
    auVar33._8_4_ = fStack_258 * fVar172;
    auVar33._12_4_ = fStack_254 * fVar193;
    auVar33._16_4_ = fStack_250 * fVar153;
    auVar33._20_4_ = fStack_24c * fVar173;
    auVar33._24_4_ = fStack_248 * fVar194;
    auVar33._28_4_ = auVar233._28_4_ + fStack_634;
    auVar34._4_4_ = fStack_23c * fVar174;
    auVar34._0_4_ = local_240 * fVar154;
    auVar34._8_4_ = fStack_238 * fVar195;
    auVar34._12_4_ = fStack_234 * fVar249;
    auVar34._16_4_ = fStack_230 * fVar313;
    auVar34._20_4_ = fStack_22c * fVar250;
    auVar34._24_4_ = fStack_228 * fVar260;
    auVar34._28_4_ = fStack_224;
    auVar28 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar19._4_4_ * fVar152;
    auVar35._0_4_ = auVar19._0_4_ * fVar175;
    auVar35._8_4_ = auVar19._8_4_ * fVar172;
    auVar35._12_4_ = auVar19._12_4_ * fVar193;
    auVar35._16_4_ = auVar19._16_4_ * fVar153;
    auVar35._20_4_ = auVar19._20_4_ * fVar173;
    auVar35._24_4_ = auVar19._24_4_ * fVar194;
    auVar35._28_4_ = fStack_224;
    auVar36._4_4_ = fVar174 * auVar18._4_4_;
    auVar36._0_4_ = fVar154 * auVar18._0_4_;
    auVar36._8_4_ = fVar195 * auVar18._8_4_;
    auVar36._12_4_ = fVar249 * auVar18._12_4_;
    auVar36._16_4_ = fVar313 * auVar18._16_4_;
    auVar36._20_4_ = fVar250 * auVar18._20_4_;
    auVar36._24_4_ = fVar260 * auVar18._24_4_;
    auVar36._28_4_ = auVar18._28_4_;
    auVar29 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = auVar148._4_4_ * fVar152;
    auVar37._0_4_ = auVar148._0_4_ * fVar175;
    auVar37._8_4_ = auVar148._8_4_ * fVar172;
    auVar37._12_4_ = auVar148._12_4_ * fVar193;
    auVar37._16_4_ = auVar148._16_4_ * fVar153;
    auVar37._20_4_ = auVar148._20_4_ * fVar173;
    auVar37._24_4_ = auVar148._24_4_ * fVar194;
    auVar37._28_4_ = auVar24._28_4_ + auVar23._28_4_;
    auVar24._4_4_ = auVar92._4_4_ * fVar174;
    auVar24._0_4_ = auVar92._0_4_ * fVar154;
    auVar24._8_4_ = auVar92._8_4_ * fVar195;
    auVar24._12_4_ = auVar92._12_4_ * fVar249;
    auVar24._16_4_ = auVar92._16_4_ * fVar313;
    auVar24._20_4_ = auVar92._20_4_ * fVar250;
    auVar24._24_4_ = auVar92._24_4_ * fVar260;
    auVar24._28_4_ = fVar262 + auVar170._28_4_;
    auVar24 = vsubps_avx(auVar37,auVar24);
    auVar22 = vminps_avx(auVar20,auVar21);
    auVar89 = vmaxps_avx(auVar20,auVar21);
    auVar20 = vminps_avx(auVar25,auVar26);
    auVar20 = vminps_avx(auVar22,auVar20);
    auVar22 = vmaxps_avx(auVar25,auVar26);
    auVar89 = vmaxps_avx(auVar89,auVar22);
    auVar21 = vminps_avx(auVar27,auVar28);
    auVar22 = vmaxps_avx(auVar27,auVar28);
    auVar23 = vminps_avx(auVar29,auVar24);
    auVar21 = vminps_avx(auVar21,auVar23);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar29,auVar24);
    auVar22 = vmaxps_avx(auVar22,auVar20);
    auVar22 = vmaxps_avx(auVar89,auVar22);
    auVar89 = vcmpps_avx(auVar21,local_280,2);
    auVar22 = vcmpps_avx(auVar22,local_2a0,5);
    auVar89 = vandps_avx(auVar22,auVar89);
    auVar22 = local_320 & auVar89;
    uVar77 = 0;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(auVar91,local_1c0);
      auVar20 = vsubps_avx(auVar92,auVar217);
      fVar152 = auVar22._0_4_ + auVar20._0_4_;
      fVar172 = auVar22._4_4_ + auVar20._4_4_;
      fVar193 = auVar22._8_4_ + auVar20._8_4_;
      fVar153 = auVar22._12_4_ + auVar20._12_4_;
      fVar173 = auVar22._16_4_ + auVar20._16_4_;
      fVar194 = auVar22._20_4_ + auVar20._20_4_;
      fVar154 = auVar22._24_4_ + auVar20._24_4_;
      auVar21 = vsubps_avx(local_200,local_1e0);
      auVar23 = vsubps_avx(auVar148,auVar233);
      fVar174 = auVar21._0_4_ + auVar23._0_4_;
      fVar195 = auVar21._4_4_ + auVar23._4_4_;
      fVar249 = auVar21._8_4_ + auVar23._8_4_;
      fVar313 = auVar21._12_4_ + auVar23._12_4_;
      fVar250 = auVar21._16_4_ + auVar23._16_4_;
      fVar260 = auVar21._20_4_ + auVar23._20_4_;
      fVar262 = auVar21._24_4_ + auVar23._24_4_;
      fVar175 = auVar23._28_4_;
      auVar38._4_4_ = local_1e0._4_4_ * fVar172;
      auVar38._0_4_ = local_1e0._0_4_ * fVar152;
      auVar38._8_4_ = local_1e0._8_4_ * fVar193;
      auVar38._12_4_ = local_1e0._12_4_ * fVar153;
      auVar38._16_4_ = local_1e0._16_4_ * fVar173;
      auVar38._20_4_ = local_1e0._20_4_ * fVar194;
      auVar38._24_4_ = local_1e0._24_4_ * fVar154;
      auVar38._28_4_ = local_1e0._28_4_;
      auVar39._4_4_ = local_1c0._4_4_ * fVar195;
      auVar39._0_4_ = local_1c0._0_4_ * fVar174;
      auVar39._8_4_ = local_1c0._8_4_ * fVar249;
      auVar39._12_4_ = local_1c0._12_4_ * fVar313;
      auVar39._16_4_ = local_1c0._16_4_ * fVar250;
      auVar39._20_4_ = local_1c0._20_4_ * fVar260;
      auVar39._24_4_ = local_1c0._24_4_ * fVar262;
      auVar39._28_4_ = local_1c0._28_4_;
      auVar23 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar281 * fVar172;
      auVar40._0_4_ = fVar279 * fVar152;
      auVar40._8_4_ = fVar283 * fVar193;
      auVar40._12_4_ = fVar292 * fVar153;
      auVar40._16_4_ = fVar299 * fVar173;
      auVar40._20_4_ = fVar300 * fVar194;
      auVar40._24_4_ = fVar301 * fVar154;
      auVar40._28_4_ = local_1e0._28_4_;
      auVar41._4_4_ = fVar195 * fStack_21c;
      auVar41._0_4_ = fVar174 * local_220;
      auVar41._8_4_ = fVar249 * fStack_218;
      auVar41._12_4_ = fVar313 * fStack_214;
      auVar41._16_4_ = fVar250 * fStack_210;
      auVar41._20_4_ = fVar260 * fStack_20c;
      auVar41._24_4_ = fVar262 * fStack_208;
      auVar41._28_4_ = fVar175;
      auVar24 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fVar172 * auVar90._4_4_;
      auVar42._0_4_ = fVar152 * auVar90._0_4_;
      auVar42._8_4_ = fVar193 * auVar90._8_4_;
      auVar42._12_4_ = fVar153 * auVar90._12_4_;
      auVar42._16_4_ = fVar173 * auVar90._16_4_;
      auVar42._20_4_ = fVar194 * auVar90._20_4_;
      auVar42._24_4_ = fVar154 * auVar90._24_4_;
      auVar42._28_4_ = fVar175;
      auVar43._4_4_ = fVar195 * fStack_5dc;
      auVar43._0_4_ = fVar174 * local_5e0;
      auVar43._8_4_ = fVar249 * fStack_5d8;
      auVar43._12_4_ = fVar313 * fStack_5d4;
      auVar43._16_4_ = fVar250 * fStack_5d0;
      auVar43._20_4_ = fVar260 * fStack_5cc;
      auVar43._24_4_ = fVar262 * fStack_5c8;
      auVar43._28_4_ = local_1e0._28_4_ + auVar169._28_4_;
      auVar90 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = local_200._4_4_ * fVar172;
      auVar44._0_4_ = local_200._0_4_ * fVar152;
      auVar44._8_4_ = local_200._8_4_ * fVar193;
      auVar44._12_4_ = local_200._12_4_ * fVar153;
      auVar44._16_4_ = local_200._16_4_ * fVar173;
      auVar44._20_4_ = local_200._20_4_ * fVar194;
      auVar44._24_4_ = local_200._24_4_ * fVar154;
      auVar44._28_4_ = local_1e0._28_4_ + auVar169._28_4_;
      auVar45._4_4_ = auVar91._4_4_ * fVar195;
      auVar45._0_4_ = auVar91._0_4_ * fVar174;
      auVar45._8_4_ = auVar91._8_4_ * fVar249;
      auVar45._12_4_ = auVar91._12_4_ * fVar313;
      auVar45._16_4_ = auVar91._16_4_ * fVar250;
      auVar45._20_4_ = auVar91._20_4_ * fVar260;
      uVar6 = auVar91._28_4_;
      auVar45._24_4_ = auVar91._24_4_ * fVar262;
      auVar45._28_4_ = uVar6;
      auVar91 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar233._4_4_ * fVar172;
      auVar46._0_4_ = auVar233._0_4_ * fVar152;
      auVar46._8_4_ = auVar233._8_4_ * fVar193;
      auVar46._12_4_ = auVar233._12_4_ * fVar153;
      auVar46._16_4_ = auVar233._16_4_ * fVar173;
      auVar46._20_4_ = auVar233._20_4_ * fVar194;
      auVar46._24_4_ = auVar233._24_4_ * fVar154;
      auVar46._28_4_ = auVar233._28_4_;
      auVar47._4_4_ = auVar217._4_4_ * fVar195;
      auVar47._0_4_ = auVar217._0_4_ * fVar174;
      auVar47._8_4_ = auVar217._8_4_ * fVar249;
      auVar47._12_4_ = auVar217._12_4_ * fVar313;
      auVar47._16_4_ = auVar217._16_4_ * fVar250;
      auVar47._20_4_ = auVar217._20_4_ * fVar260;
      auVar47._24_4_ = auVar217._24_4_ * fVar262;
      auVar47._28_4_ = auVar217._28_4_;
      auVar170 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar172 * fStack_25c;
      auVar48._0_4_ = fVar152 * local_260;
      auVar48._8_4_ = fVar193 * fStack_258;
      auVar48._12_4_ = fVar153 * fStack_254;
      auVar48._16_4_ = fVar173 * fStack_250;
      auVar48._20_4_ = fVar194 * fStack_24c;
      auVar48._24_4_ = fVar154 * fStack_248;
      auVar48._28_4_ = auVar233._28_4_;
      auVar49._4_4_ = fVar195 * fStack_23c;
      auVar49._0_4_ = fVar174 * local_240;
      auVar49._8_4_ = fVar249 * fStack_238;
      auVar49._12_4_ = fVar313 * fStack_234;
      auVar49._16_4_ = fVar250 * fStack_230;
      auVar49._20_4_ = fVar260 * fStack_22c;
      auVar49._24_4_ = fVar262 * fStack_228;
      auVar49._28_4_ = uVar6;
      auVar25 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar172 * auVar19._4_4_;
      auVar50._0_4_ = fVar152 * auVar19._0_4_;
      auVar50._8_4_ = fVar193 * auVar19._8_4_;
      auVar50._12_4_ = fVar153 * auVar19._12_4_;
      auVar50._16_4_ = fVar173 * auVar19._16_4_;
      auVar50._20_4_ = fVar194 * auVar19._20_4_;
      auVar50._24_4_ = fVar154 * auVar19._24_4_;
      auVar50._28_4_ = uVar6;
      auVar51._4_4_ = fVar195 * auVar18._4_4_;
      auVar51._0_4_ = fVar174 * auVar18._0_4_;
      auVar51._8_4_ = fVar249 * auVar18._8_4_;
      auVar51._12_4_ = fVar313 * auVar18._12_4_;
      auVar51._16_4_ = fVar250 * auVar18._16_4_;
      auVar51._20_4_ = fVar260 * auVar18._20_4_;
      auVar51._24_4_ = fVar262 * auVar18._24_4_;
      auVar51._28_4_ = local_200._28_4_;
      auVar18 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = auVar148._4_4_ * fVar172;
      auVar52._0_4_ = auVar148._0_4_ * fVar152;
      auVar52._8_4_ = auVar148._8_4_ * fVar193;
      auVar52._12_4_ = auVar148._12_4_ * fVar153;
      auVar52._16_4_ = auVar148._16_4_ * fVar173;
      auVar52._20_4_ = auVar148._20_4_ * fVar194;
      auVar52._24_4_ = auVar148._24_4_ * fVar154;
      auVar52._28_4_ = auVar22._28_4_ + auVar20._28_4_;
      auVar53._4_4_ = auVar92._4_4_ * fVar195;
      auVar53._0_4_ = auVar92._0_4_ * fVar174;
      auVar53._8_4_ = auVar92._8_4_ * fVar249;
      auVar53._12_4_ = auVar92._12_4_ * fVar313;
      auVar53._16_4_ = auVar92._16_4_ * fVar250;
      auVar53._20_4_ = auVar92._20_4_ * fVar260;
      auVar53._24_4_ = auVar92._24_4_ * fVar262;
      auVar53._28_4_ = auVar21._28_4_ + fVar175;
      auVar92 = vsubps_avx(auVar52,auVar53);
      auVar20 = vminps_avx(auVar23,auVar24);
      auVar22 = vmaxps_avx(auVar23,auVar24);
      auVar21 = vminps_avx(auVar90,auVar91);
      auVar21 = vminps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar90,auVar91);
      auVar22 = vmaxps_avx(auVar22,auVar20);
      auVar23 = vminps_avx(auVar170,auVar25);
      auVar20 = vmaxps_avx(auVar170,auVar25);
      auVar90 = vminps_avx(auVar18,auVar92);
      auVar23 = vminps_avx(auVar23,auVar90);
      auVar23 = vminps_avx(auVar21,auVar23);
      auVar21 = vmaxps_avx(auVar18,auVar92);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vmaxps_avx(auVar22,auVar20);
      auVar22 = vcmpps_avx(auVar23,local_280,2);
      auVar20 = vcmpps_avx(auVar20,local_2a0,5);
      auVar22 = vandps_avx(auVar20,auVar22);
      auVar89 = vandps_avx(auVar89,local_320);
      auVar20 = auVar89 & auVar22;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0x7f,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0xbf,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar20[0x1f] < '\0') {
        auVar89 = vandps_avx(auVar22,auVar89);
        uVar77 = vmovmskps_avx(auVar89);
      }
    }
    if (uVar77 != 0) {
      auStack_480[uVar78] = uVar77;
      uVar7 = vmovlps_avx(local_3e0);
      *(undefined8 *)(afStack_300 + uVar78 * 2) = uVar7;
      uVar8 = vmovlps_avx(_local_6b0);
      auStack_1a0[uVar78] = uVar8;
      uVar78 = (ulong)((int)uVar78 + 1);
    }
    auVar310 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
    auVar321 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar78 == 0) {
        if (bVar70) {
          return local_6f1;
        }
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar88._4_4_ = uVar6;
        auVar88._0_4_ = uVar6;
        auVar88._8_4_ = uVar6;
        auVar88._12_4_ = uVar6;
        auVar104 = vcmpps_avx(local_3f0,auVar88,2);
        uVar71 = vmovmskps_avx(auVar104);
        uVar71 = (uint)uVar79 & uVar71;
        local_6f1 = uVar71 != 0;
        if (!local_6f1) {
          return local_6f1;
        }
        goto LAB_00ee7063;
      }
      uVar74 = (int)uVar78 - 1;
      uVar76 = (ulong)uVar74;
      uVar77 = auStack_480[uVar76];
      fVar175 = afStack_300[uVar76 * 2];
      fVar152 = afStack_300[uVar76 * 2 + 1];
      register0x00001448 = 0;
      local_6b0 = (undefined1  [8])auStack_1a0[uVar76];
      uVar8 = 0;
      if (uVar77 != 0) {
        for (; (uVar77 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar77 = uVar77 - 1 & uVar77;
      auStack_480[uVar76] = uVar77;
      if (uVar77 == 0) {
        uVar78 = (ulong)uVar74;
      }
      fVar193 = (float)(uVar8 + 1) * 0.14285715;
      fVar172 = (1.0 - (float)uVar8 * 0.14285715) * fVar175 + fVar152 * (float)uVar8 * 0.14285715;
      fVar175 = (1.0 - fVar193) * fVar175 + fVar152 * fVar193;
      fVar152 = fVar175 - fVar172;
      if (0.16666667 <= fVar152) break;
      auVar104 = vshufps_avx(_local_6b0,_local_6b0,0x50);
      auVar200 = vsubps_avx(auVar310._0_16_,auVar104);
      fVar193 = auVar104._0_4_;
      fVar173 = auVar104._4_4_;
      fVar154 = auVar104._8_4_;
      fVar195 = auVar104._12_4_;
      fVar153 = auVar200._0_4_;
      fVar194 = auVar200._4_4_;
      fVar174 = auVar200._8_4_;
      fVar249 = auVar200._12_4_;
      auVar139._0_4_ = auVar252._0_4_ * fVar193 + auVar277._0_4_ * fVar153;
      auVar139._4_4_ = auVar252._4_4_ * fVar173 + auVar277._4_4_ * fVar194;
      auVar139._8_4_ = auVar252._0_4_ * fVar154 + auVar277._0_4_ * fVar174;
      auVar139._12_4_ = auVar252._4_4_ * fVar195 + auVar277._4_4_ * fVar249;
      auVar162._0_4_ = auVar224._0_4_ * fVar193 + fVar95 * fVar153;
      auVar162._4_4_ = auVar224._4_4_ * fVar173 + fVar116 * fVar194;
      auVar162._8_4_ = auVar224._0_4_ * fVar154 + fVar95 * fVar174;
      auVar162._12_4_ = auVar224._4_4_ * fVar195 + fVar116 * fVar249;
      auVar184._0_4_ = auVar98._0_4_ * fVar193 + fVar153 * (float)local_490._0_4_;
      auVar184._4_4_ = auVar98._4_4_ * fVar173 + fVar194 * (float)local_490._4_4_;
      auVar184._8_4_ = auVar98._0_4_ * fVar154 + fVar174 * fStack_488;
      auVar184._12_4_ = auVar98._4_4_ * fVar195 + fVar249 * fStack_484;
      auVar100._0_4_ = auVar84._0_4_ * fVar193 + fVar153 * (float)local_4a0._0_4_;
      auVar100._4_4_ = auVar84._4_4_ * fVar173 + fVar194 * (float)local_4a0._4_4_;
      auVar100._8_4_ = auVar84._0_4_ * fVar154 + fVar174 * fStack_498;
      auVar100._12_4_ = auVar84._4_4_ * fVar195 + fVar249 * fStack_494;
      auVar129._16_16_ = auVar139;
      auVar129._0_16_ = auVar139;
      auVar149._16_16_ = auVar162;
      auVar149._0_16_ = auVar162;
      auVar171._16_16_ = auVar184;
      auVar171._0_16_ = auVar184;
      auVar89 = vshufps_avx(ZEXT2032(CONCAT416(fVar175,ZEXT416((uint)fVar172))),
                            ZEXT2032(CONCAT416(fVar175,ZEXT416((uint)fVar172))),0);
      auVar22 = vsubps_avx(auVar149,auVar129);
      fVar193 = auVar89._0_4_;
      fVar153 = auVar89._4_4_;
      fVar173 = auVar89._8_4_;
      fVar194 = auVar89._12_4_;
      fVar154 = auVar89._16_4_;
      fVar174 = auVar89._20_4_;
      fVar195 = auVar89._24_4_;
      auVar130._0_4_ = auVar139._0_4_ + auVar22._0_4_ * fVar193;
      auVar130._4_4_ = auVar139._4_4_ + auVar22._4_4_ * fVar153;
      auVar130._8_4_ = auVar139._8_4_ + auVar22._8_4_ * fVar173;
      auVar130._12_4_ = auVar139._12_4_ + auVar22._12_4_ * fVar194;
      auVar130._16_4_ = auVar139._0_4_ + auVar22._16_4_ * fVar154;
      auVar130._20_4_ = auVar139._4_4_ + auVar22._20_4_ * fVar174;
      auVar130._24_4_ = auVar139._8_4_ + auVar22._24_4_ * fVar195;
      auVar130._28_4_ = auVar139._12_4_ + auVar22._28_4_;
      auVar22 = vsubps_avx(auVar171,auVar149);
      auVar150._0_4_ = auVar162._0_4_ + auVar22._0_4_ * fVar193;
      auVar150._4_4_ = auVar162._4_4_ + auVar22._4_4_ * fVar153;
      auVar150._8_4_ = auVar162._8_4_ + auVar22._8_4_ * fVar173;
      auVar150._12_4_ = auVar162._12_4_ + auVar22._12_4_ * fVar194;
      auVar150._16_4_ = auVar162._0_4_ + auVar22._16_4_ * fVar154;
      auVar150._20_4_ = auVar162._4_4_ + auVar22._20_4_ * fVar174;
      auVar150._24_4_ = auVar162._8_4_ + auVar22._24_4_ * fVar195;
      auVar150._28_4_ = auVar162._12_4_ + auVar22._28_4_;
      auVar104 = vsubps_avx(auVar100,auVar184);
      auVar113._0_4_ = auVar184._0_4_ + auVar104._0_4_ * fVar193;
      auVar113._4_4_ = auVar184._4_4_ + auVar104._4_4_ * fVar153;
      auVar113._8_4_ = auVar184._8_4_ + auVar104._8_4_ * fVar173;
      auVar113._12_4_ = auVar184._12_4_ + auVar104._12_4_ * fVar194;
      auVar113._16_4_ = auVar184._0_4_ + auVar104._0_4_ * fVar154;
      auVar113._20_4_ = auVar184._4_4_ + auVar104._4_4_ * fVar174;
      auVar113._24_4_ = auVar184._8_4_ + auVar104._8_4_ * fVar195;
      auVar113._28_4_ = auVar184._12_4_ + auVar104._12_4_;
      auVar22 = vsubps_avx(auVar150,auVar130);
      auVar131._0_4_ = auVar130._0_4_ + fVar193 * auVar22._0_4_;
      auVar131._4_4_ = auVar130._4_4_ + fVar153 * auVar22._4_4_;
      auVar131._8_4_ = auVar130._8_4_ + fVar173 * auVar22._8_4_;
      auVar131._12_4_ = auVar130._12_4_ + fVar194 * auVar22._12_4_;
      auVar131._16_4_ = auVar130._16_4_ + fVar154 * auVar22._16_4_;
      auVar131._20_4_ = auVar130._20_4_ + fVar174 * auVar22._20_4_;
      auVar131._24_4_ = auVar130._24_4_ + fVar195 * auVar22._24_4_;
      auVar131._28_4_ = auVar130._28_4_ + auVar22._28_4_;
      auVar22 = vsubps_avx(auVar113,auVar150);
      auVar114._0_4_ = auVar150._0_4_ + fVar193 * auVar22._0_4_;
      auVar114._4_4_ = auVar150._4_4_ + fVar153 * auVar22._4_4_;
      auVar114._8_4_ = auVar150._8_4_ + fVar173 * auVar22._8_4_;
      auVar114._12_4_ = auVar150._12_4_ + fVar194 * auVar22._12_4_;
      auVar114._16_4_ = auVar150._16_4_ + fVar154 * auVar22._16_4_;
      auVar114._20_4_ = auVar150._20_4_ + fVar174 * auVar22._20_4_;
      auVar114._24_4_ = auVar150._24_4_ + fVar195 * auVar22._24_4_;
      auVar114._28_4_ = auVar150._28_4_ + auVar22._28_4_;
      auVar22 = vsubps_avx(auVar114,auVar131);
      auVar140._0_4_ = auVar131._0_4_ + fVar193 * auVar22._0_4_;
      auVar140._4_4_ = auVar131._4_4_ + fVar153 * auVar22._4_4_;
      auVar140._8_4_ = auVar131._8_4_ + fVar173 * auVar22._8_4_;
      auVar140._12_4_ = auVar131._12_4_ + fVar194 * auVar22._12_4_;
      auVar151._16_4_ = auVar131._16_4_ + fVar154 * auVar22._16_4_;
      auVar151._0_16_ = auVar140;
      auVar151._20_4_ = auVar131._20_4_ + fVar174 * auVar22._20_4_;
      auVar151._24_4_ = auVar131._24_4_ + fVar195 * auVar22._24_4_;
      auVar151._28_4_ = auVar131._28_4_ + auVar150._28_4_;
      fVar193 = auVar22._4_4_ * 3.0;
      auVar122 = auVar151._16_16_;
      auVar103 = vshufps_avx(ZEXT416((uint)(fVar152 * 0.33333334)),
                             ZEXT416((uint)(fVar152 * 0.33333334)),0);
      auVar240._0_4_ = auVar140._0_4_ + auVar103._0_4_ * auVar22._0_4_ * 3.0;
      auVar240._4_4_ = auVar140._4_4_ + auVar103._4_4_ * fVar193;
      auVar240._8_4_ = auVar140._8_4_ + auVar103._8_4_ * auVar22._8_4_ * 3.0;
      auVar240._12_4_ = auVar140._12_4_ + auVar103._12_4_ * auVar22._12_4_ * 3.0;
      auVar191 = vshufpd_avx(auVar140,auVar140,3);
      auVar83 = vshufpd_avx(auVar122,auVar122,3);
      auVar104 = vsubps_avx(auVar191,auVar140);
      auVar200 = vsubps_avx(auVar83,auVar122);
      auVar101._0_4_ = auVar104._0_4_ + auVar200._0_4_;
      auVar101._4_4_ = auVar104._4_4_ + auVar200._4_4_;
      auVar101._8_4_ = auVar104._8_4_ + auVar200._8_4_;
      auVar101._12_4_ = auVar104._12_4_ + auVar200._12_4_;
      auVar104 = vmovshdup_avx(auVar140);
      auVar200 = vmovshdup_avx(auVar240);
      auVar81 = vshufps_avx(auVar101,auVar101,0);
      auVar86 = vshufps_avx(auVar101,auVar101,0x55);
      fVar174 = auVar86._0_4_;
      fVar195 = auVar86._4_4_;
      fVar249 = auVar86._8_4_;
      fVar313 = auVar86._12_4_;
      fVar153 = auVar81._0_4_;
      fVar173 = auVar81._4_4_;
      fVar194 = auVar81._8_4_;
      fVar154 = auVar81._12_4_;
      auVar225._0_4_ = fVar153 * auVar140._0_4_ + fVar174 * auVar104._0_4_;
      auVar225._4_4_ = fVar173 * auVar140._4_4_ + fVar195 * auVar104._4_4_;
      auVar225._8_4_ = fVar194 * auVar140._8_4_ + fVar249 * auVar104._8_4_;
      auVar225._12_4_ = fVar154 * auVar140._12_4_ + fVar313 * auVar104._12_4_;
      auVar241._0_4_ = auVar240._0_4_ * fVar153 + fVar174 * auVar200._0_4_;
      auVar241._4_4_ = auVar240._4_4_ * fVar173 + fVar195 * auVar200._4_4_;
      auVar241._8_4_ = auVar240._8_4_ * fVar194 + fVar249 * auVar200._8_4_;
      auVar241._12_4_ = auVar240._12_4_ * fVar154 + fVar313 * auVar200._12_4_;
      auVar200 = vshufps_avx(auVar225,auVar225,0xe8);
      auVar81 = vshufps_avx(auVar241,auVar241,0xe8);
      auVar104 = vcmpps_avx(auVar200,auVar81,1);
      uVar77 = vextractps_avx(auVar104,0);
      auVar86 = auVar241;
      if ((uVar77 & 1) == 0) {
        auVar86 = auVar225;
      }
      auVar102._0_4_ = auVar103._0_4_ * auVar22._16_4_ * 3.0;
      auVar102._4_4_ = auVar103._4_4_ * fVar193;
      auVar102._8_4_ = auVar103._8_4_ * auVar22._24_4_ * 3.0;
      auVar102._12_4_ = auVar103._12_4_ * auVar89._28_4_;
      auVar118 = vsubps_avx(auVar122,auVar102);
      auVar103 = vmovshdup_avx(auVar118);
      auVar122 = vmovshdup_avx(auVar122);
      fVar193 = auVar118._0_4_;
      fVar250 = auVar118._4_4_;
      auVar318._0_4_ = fVar153 * fVar193 + fVar174 * auVar103._0_4_;
      auVar318._4_4_ = fVar173 * fVar250 + fVar195 * auVar103._4_4_;
      auVar318._8_4_ = fVar194 * auVar118._8_4_ + fVar249 * auVar103._8_4_;
      auVar318._12_4_ = fVar154 * auVar118._12_4_ + fVar313 * auVar103._12_4_;
      auVar295._0_4_ = fVar153 * auVar151._16_4_ + fVar174 * auVar122._0_4_;
      auVar295._4_4_ = fVar173 * auVar151._20_4_ + fVar195 * auVar122._4_4_;
      auVar295._8_4_ = fVar194 * auVar151._24_4_ + fVar249 * auVar122._8_4_;
      auVar295._12_4_ = fVar154 * auVar151._28_4_ + fVar313 * auVar122._12_4_;
      auVar122 = vshufps_avx(auVar318,auVar318,0xe8);
      auVar96 = vshufps_avx(auVar295,auVar295,0xe8);
      auVar103 = vcmpps_avx(auVar122,auVar96,1);
      uVar77 = vextractps_avx(auVar103,0);
      auVar134 = auVar295;
      if ((uVar77 & 1) == 0) {
        auVar134 = auVar318;
      }
      auVar86 = vmaxss_avx(auVar134,auVar86);
      auVar200 = vminps_avx(auVar200,auVar81);
      auVar81 = vminps_avx(auVar122,auVar96);
      auVar81 = vminps_avx(auVar200,auVar81);
      auVar104 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vblendps_avx(auVar104,auVar103,2);
      auVar103 = vpslld_avx(auVar104,0x1f);
      auVar104 = vshufpd_avx(auVar241,auVar241,1);
      auVar104 = vinsertps_avx(auVar104,auVar295,0x9c);
      auVar200 = vshufpd_avx(auVar225,auVar225,1);
      auVar200 = vinsertps_avx(auVar200,auVar318,0x9c);
      auVar104 = vblendvps_avx(auVar200,auVar104,auVar103);
      auVar200 = vmovshdup_avx(auVar104);
      auVar104 = vmaxss_avx(auVar200,auVar104);
      fVar194 = auVar81._0_4_;
      auVar200 = vmovshdup_avx(auVar81);
      fVar173 = auVar104._0_4_;
      fVar154 = auVar200._0_4_;
      fVar153 = auVar86._0_4_;
      if ((0.0001 <= fVar194) || (fVar173 <= -0.0001)) {
        if ((-0.0001 < fVar153 && fVar154 < 0.0001) ||
           ((fVar194 < 0.0001 && -0.0001 < fVar153 || (fVar154 < 0.0001 && -0.0001 < fVar173))))
        goto LAB_00ee82c8;
LAB_00ee8ed2:
        bVar54 = true;
        auVar310 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,&DAT_3f8000003f800000)));
        auVar321 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_00ee82c8:
        auVar321 = ZEXT464(0) << 0x20;
        auVar103 = vcmpps_avx(auVar81,ZEXT416(0) << 0x20,1);
        auVar200 = vcmpss_avx(auVar86,ZEXT416(0),1);
        auVar307._8_4_ = 0x3f800000;
        auVar307._0_8_ = &DAT_3f8000003f800000;
        auVar307._12_4_ = 0x3f800000;
        auVar310 = ZEXT1664(auVar307);
        auVar185._8_4_ = 0xbf800000;
        auVar185._0_8_ = 0xbf800000bf800000;
        auVar185._12_4_ = 0xbf800000;
        auVar200 = vblendvps_avx(auVar307,auVar185,auVar200);
        auVar103 = vblendvps_avx(auVar307,auVar185,auVar103);
        auVar122 = vcmpss_avx(auVar200,auVar103,4);
        auVar122 = vpshufd_avx(ZEXT416(auVar122._0_4_ & 1),0x50);
        auVar122 = vpslld_avx(auVar122,0x1f);
        auVar122 = vpsrad_avx(auVar122,0x1f);
        auVar122 = vpandn_avx(auVar122,_DAT_02020eb0);
        auVar96 = vmovshdup_avx(auVar103);
        fVar174 = auVar96._0_4_;
        if ((auVar103._0_4_ != fVar174) || (NAN(auVar103._0_4_) || NAN(fVar174))) {
          if ((fVar154 != fVar194) || (NAN(fVar154) || NAN(fVar194))) {
            fVar194 = -fVar194 / (fVar154 - fVar194);
            auVar103 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar194) * 0.0 + fVar194)));
          }
          else {
            auVar103 = vcmpss_avx(auVar81,ZEXT416(0),0);
            auVar103 = vpshufd_avx(ZEXT416(auVar103._0_4_ & 1),0x50);
            auVar103 = vpslld_avx(auVar103,0x1f);
            auVar103 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar103);
          }
          auVar96 = vcmpps_avx(auVar122,auVar103,1);
          auVar81 = vblendps_avx(auVar122,auVar103,2);
          auVar103 = vblendps_avx(auVar103,auVar122,2);
          auVar122 = vblendvps_avx(auVar103,auVar81,auVar96);
        }
        auVar104 = vcmpss_avx(auVar104,ZEXT416(0),1);
        auVar123._8_4_ = 0xbf800000;
        auVar123._0_8_ = 0xbf800000bf800000;
        auVar123._12_4_ = 0xbf800000;
        auVar104 = vblendvps_avx(auVar307,auVar123,auVar104);
        fVar194 = auVar104._0_4_;
        if ((auVar200._0_4_ != fVar194) || (NAN(auVar200._0_4_) || NAN(fVar194))) {
          if ((fVar173 != fVar153) || (NAN(fVar173) || NAN(fVar153))) {
            fVar153 = -fVar153 / (fVar173 - fVar153);
            auVar104 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar153) * 0.0 + fVar153)));
          }
          else {
            auVar104 = vcmpss_avx(auVar86,ZEXT416(0),0);
            auVar104 = vpshufd_avx(ZEXT416(auVar104._0_4_ & 1),0x50);
            auVar104 = vpslld_avx(auVar104,0x1f);
            auVar104 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar104);
          }
          auVar103 = vcmpps_avx(auVar122,auVar104,1);
          auVar200 = vblendps_avx(auVar122,auVar104,2);
          auVar104 = vblendps_avx(auVar104,auVar122,2);
          auVar122 = vblendvps_avx(auVar104,auVar200,auVar103);
        }
        if ((fVar174 != fVar194) || (NAN(fVar174) || NAN(fVar194))) {
          auVar104 = vcmpps_avx(auVar122,auVar307,1);
          auVar200 = vinsertps_avx(auVar122,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar186._4_12_ = auVar122._4_12_;
          auVar186._0_4_ = 0x3f800000;
          auVar122 = vblendvps_avx(auVar186,auVar200,auVar104);
        }
        auVar104 = vcmpps_avx(auVar122,_DAT_01fec6f0,1);
        auVar57._12_4_ = 0;
        auVar57._0_12_ = auVar122._4_12_;
        auVar200 = vinsertps_avx(auVar122,ZEXT416(0x3f800000),0x10);
        auVar104 = vblendvps_avx(auVar200,auVar57 << 0x20,auVar104);
        auVar200 = vmovshdup_avx(auVar104);
        bVar54 = true;
        if (auVar104._0_4_ <= auVar200._0_4_) {
          auVar105._0_4_ = auVar104._0_4_ + -0.1;
          auVar105._4_4_ = auVar104._4_4_ + 0.1;
          auVar105._8_4_ = auVar104._8_4_ + 0.0;
          auVar105._12_4_ = auVar104._12_4_ + 0.0;
          auVar103 = vshufpd_avx(auVar240,auVar240,3);
          auVar141._8_8_ = 0x3f80000000000000;
          auVar141._0_8_ = 0x3f80000000000000;
          auVar104 = vcmpps_avx(auVar105,auVar141,1);
          auVar58._12_4_ = 0;
          auVar58._0_12_ = auVar105._4_12_;
          auVar200 = vinsertps_avx(auVar105,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar104 = vblendvps_avx(auVar200,auVar58 << 0x20,auVar104);
          auVar200 = vshufpd_avx(auVar118,auVar118,3);
          auVar81 = vshufps_avx(auVar104,auVar104,0x50);
          auVar86 = vsubps_avx(auVar307,auVar81);
          local_620 = auVar191._0_4_;
          fStack_61c = auVar191._4_4_;
          fStack_618 = auVar191._8_4_;
          fStack_614 = auVar191._12_4_;
          fVar153 = auVar81._0_4_;
          fVar173 = auVar81._4_4_;
          fVar194 = auVar81._8_4_;
          fVar154 = auVar81._12_4_;
          local_660 = auVar83._0_4_;
          fStack_65c = auVar83._4_4_;
          fStack_658 = auVar83._8_4_;
          fStack_654 = auVar83._12_4_;
          fVar174 = auVar86._0_4_;
          fVar195 = auVar86._4_4_;
          fVar249 = auVar86._8_4_;
          fVar313 = auVar86._12_4_;
          auVar124._0_4_ = fVar153 * local_620 + fVar174 * auVar140._0_4_;
          auVar124._4_4_ = fVar173 * fStack_61c + fVar195 * auVar140._4_4_;
          auVar124._8_4_ = fVar194 * fStack_618 + fVar249 * auVar140._0_4_;
          auVar124._12_4_ = fVar154 * fStack_614 + fVar313 * auVar140._4_4_;
          auVar163._0_4_ = fVar153 * auVar103._0_4_ + fVar174 * auVar240._0_4_;
          auVar163._4_4_ = fVar173 * auVar103._4_4_ + fVar195 * auVar240._4_4_;
          auVar163._8_4_ = fVar194 * auVar103._8_4_ + fVar249 * auVar240._0_4_;
          auVar163._12_4_ = fVar154 * auVar103._12_4_ + fVar313 * auVar240._4_4_;
          auVar215._0_4_ = fVar153 * auVar200._0_4_ + fVar174 * fVar193;
          auVar215._4_4_ = fVar173 * auVar200._4_4_ + fVar195 * fVar250;
          auVar215._8_4_ = fVar194 * auVar200._8_4_ + fVar249 * fVar193;
          auVar215._12_4_ = fVar154 * auVar200._12_4_ + fVar313 * fVar250;
          auVar226._0_4_ = fVar153 * local_660 + fVar174 * auVar151._16_4_;
          auVar226._4_4_ = fVar173 * fStack_65c + fVar195 * auVar151._20_4_;
          auVar226._8_4_ = fVar194 * fStack_658 + fVar249 * auVar151._16_4_;
          auVar226._12_4_ = fVar154 * fStack_654 + fVar313 * auVar151._20_4_;
          auVar83 = vsubps_avx(auVar307,auVar104);
          auVar200 = vmovshdup_avx(_local_6b0);
          auVar191 = vmovsldup_avx(_local_6b0);
          local_6b0._0_4_ = auVar83._0_4_ * auVar191._0_4_ + auVar200._0_4_ * auVar104._0_4_;
          local_6b0._4_4_ = auVar83._4_4_ * auVar191._4_4_ + auVar200._4_4_ * auVar104._4_4_;
          fStack_6a8 = auVar83._8_4_ * auVar191._8_4_ + auVar200._8_4_ * auVar104._8_4_;
          fStack_6a4 = auVar83._12_4_ * auVar191._12_4_ + auVar200._12_4_ * auVar104._12_4_;
          auVar118 = vmovshdup_avx(_local_6b0);
          auVar104 = vsubps_avx(auVar163,auVar124);
          auVar187._0_4_ = auVar104._0_4_ * 3.0;
          auVar187._4_4_ = auVar104._4_4_ * 3.0;
          auVar187._8_4_ = auVar104._8_4_ * 3.0;
          auVar187._12_4_ = auVar104._12_4_ * 3.0;
          auVar104 = vsubps_avx(auVar215,auVar163);
          auVar203._0_4_ = auVar104._0_4_ * 3.0;
          auVar203._4_4_ = auVar104._4_4_ * 3.0;
          auVar203._8_4_ = auVar104._8_4_ * 3.0;
          auVar203._12_4_ = auVar104._12_4_ * 3.0;
          auVar104 = vsubps_avx(auVar226,auVar215);
          auVar242._0_4_ = auVar104._0_4_ * 3.0;
          auVar242._4_4_ = auVar104._4_4_ * 3.0;
          auVar242._8_4_ = auVar104._8_4_ * 3.0;
          auVar242._12_4_ = auVar104._12_4_ * 3.0;
          auVar200 = vminps_avx(auVar203,auVar242);
          auVar104 = vmaxps_avx(auVar203,auVar242);
          auVar200 = vminps_avx(auVar187,auVar200);
          auVar104 = vmaxps_avx(auVar187,auVar104);
          auVar191 = vshufpd_avx(auVar200,auVar200,3);
          auVar83 = vshufpd_avx(auVar104,auVar104,3);
          auVar200 = vminps_avx(auVar200,auVar191);
          auVar104 = vmaxps_avx(auVar104,auVar83);
          auVar191 = vshufps_avx(ZEXT416((uint)(1.0 / fVar152)),ZEXT416((uint)(1.0 / fVar152)),0);
          auVar188._0_4_ = auVar191._0_4_ * auVar200._0_4_;
          auVar188._4_4_ = auVar191._4_4_ * auVar200._4_4_;
          auVar188._8_4_ = auVar191._8_4_ * auVar200._8_4_;
          auVar188._12_4_ = auVar191._12_4_ * auVar200._12_4_;
          auVar204._0_4_ = auVar104._0_4_ * auVar191._0_4_;
          auVar204._4_4_ = auVar104._4_4_ * auVar191._4_4_;
          auVar204._8_4_ = auVar104._8_4_ * auVar191._8_4_;
          auVar204._12_4_ = auVar104._12_4_ * auVar191._12_4_;
          auVar86 = ZEXT416((uint)(1.0 / (auVar118._0_4_ - (float)local_6b0._0_4_)));
          auVar104 = vshufpd_avx(auVar124,auVar124,3);
          auVar200 = vshufpd_avx(auVar163,auVar163,3);
          auVar191 = vshufpd_avx(auVar215,auVar215,3);
          auVar83 = vshufpd_avx(auVar226,auVar226,3);
          auVar104 = vsubps_avx(auVar104,auVar124);
          auVar103 = vsubps_avx(auVar200,auVar163);
          auVar81 = vsubps_avx(auVar191,auVar215);
          auVar83 = vsubps_avx(auVar83,auVar226);
          auVar200 = vminps_avx(auVar104,auVar103);
          auVar104 = vmaxps_avx(auVar104,auVar103);
          auVar191 = vminps_avx(auVar81,auVar83);
          auVar191 = vminps_avx(auVar200,auVar191);
          auVar200 = vmaxps_avx(auVar81,auVar83);
          auVar104 = vmaxps_avx(auVar104,auVar200);
          auVar200 = vshufps_avx(auVar86,auVar86,0);
          auVar253._0_4_ = auVar200._0_4_ * auVar191._0_4_;
          auVar253._4_4_ = auVar200._4_4_ * auVar191._4_4_;
          auVar253._8_4_ = auVar200._8_4_ * auVar191._8_4_;
          auVar253._12_4_ = auVar200._12_4_ * auVar191._12_4_;
          auVar266._0_4_ = auVar200._0_4_ * auVar104._0_4_;
          auVar266._4_4_ = auVar200._4_4_ * auVar104._4_4_;
          auVar266._8_4_ = auVar200._8_4_ * auVar104._8_4_;
          auVar266._12_4_ = auVar200._12_4_ * auVar104._12_4_;
          auVar104 = vmovsldup_avx(_local_6b0);
          auVar216._4_12_ = auVar104._4_12_;
          auVar216._0_4_ = fVar172;
          auVar227._4_12_ = local_6b0._4_12_;
          auVar227._0_4_ = fVar175;
          auVar87._0_4_ = (fVar175 + fVar172) * 0.5;
          auVar87._4_4_ = ((float)local_6b0._4_4_ + auVar104._4_4_) * 0.5;
          auVar87._8_4_ = (fStack_6a8 + auVar104._8_4_) * 0.5;
          auVar87._12_4_ = (fStack_6a4 + auVar104._12_4_) * 0.5;
          auVar104 = vshufps_avx(auVar87,auVar87,0);
          fVar193 = auVar104._0_4_;
          fVar153 = auVar104._4_4_;
          fVar173 = auVar104._8_4_;
          fVar194 = auVar104._12_4_;
          local_550 = auVar16._0_4_;
          fStack_54c = auVar16._4_4_;
          fStack_548 = auVar16._8_4_;
          fStack_544 = auVar16._12_4_;
          auVar164._0_4_ = fVar193 * (float)local_330._0_4_ + local_550;
          auVar164._4_4_ = fVar153 * (float)local_330._4_4_ + fStack_54c;
          auVar164._8_4_ = fVar173 * fStack_328 + fStack_548;
          auVar164._12_4_ = fVar194 * fStack_324 + fStack_544;
          local_560 = auVar265._0_4_;
          fStack_55c = auVar265._4_4_;
          fStack_558 = auVar265._8_4_;
          fStack_554 = auVar265._12_4_;
          auVar243._0_4_ = fVar193 * (float)local_340._0_4_ + local_560;
          auVar243._4_4_ = fVar153 * (float)local_340._4_4_ + fStack_55c;
          auVar243._8_4_ = fVar173 * fStack_338 + fStack_558;
          auVar243._12_4_ = fVar194 * fStack_334 + fStack_554;
          local_570 = auVar17._0_4_;
          fStack_56c = auVar17._4_4_;
          fStack_568 = auVar17._8_4_;
          fStack_564 = auVar17._12_4_;
          auVar278._0_4_ = fVar193 * (float)local_350._0_4_ + local_570;
          auVar278._4_4_ = fVar153 * (float)local_350._4_4_ + fStack_56c;
          auVar278._8_4_ = fVar173 * fStack_348 + fStack_568;
          auVar278._12_4_ = fVar194 * fStack_344 + fStack_564;
          auVar104 = vsubps_avx(auVar243,auVar164);
          auVar165._0_4_ = auVar104._0_4_ * fVar193 + auVar164._0_4_;
          auVar165._4_4_ = auVar104._4_4_ * fVar153 + auVar164._4_4_;
          auVar165._8_4_ = auVar104._8_4_ * fVar173 + auVar164._8_4_;
          auVar165._12_4_ = auVar104._12_4_ * fVar194 + auVar164._12_4_;
          auVar104 = vsubps_avx(auVar278,auVar243);
          auVar244._0_4_ = auVar243._0_4_ + auVar104._0_4_ * fVar193;
          auVar244._4_4_ = auVar243._4_4_ + auVar104._4_4_ * fVar153;
          auVar244._8_4_ = auVar243._8_4_ + auVar104._8_4_ * fVar173;
          auVar244._12_4_ = auVar243._12_4_ + auVar104._12_4_ * fVar194;
          auVar104 = vsubps_avx(auVar244,auVar165);
          fVar193 = auVar165._0_4_ + auVar104._0_4_ * fVar193;
          fVar153 = auVar165._4_4_ + auVar104._4_4_ * fVar153;
          auVar125._0_8_ = CONCAT44(fVar153,fVar193);
          auVar125._8_4_ = auVar165._8_4_ + auVar104._8_4_ * fVar173;
          auVar125._12_4_ = auVar165._12_4_ + auVar104._12_4_ * fVar194;
          fVar173 = auVar104._0_4_ * 3.0;
          fVar194 = auVar104._4_4_ * 3.0;
          auVar166._0_8_ = CONCAT44(fVar194,fVar173);
          auVar166._8_4_ = auVar104._8_4_ * 3.0;
          auVar166._12_4_ = auVar104._12_4_ * 3.0;
          auVar245._8_8_ = auVar125._0_8_;
          auVar245._0_8_ = auVar125._0_8_;
          auVar104 = vshufpd_avx(auVar125,auVar125,3);
          auVar200 = vshufps_avx(auVar87,auVar87,0x55);
          auVar81 = vsubps_avx(auVar104,auVar245);
          auVar246._0_4_ = auVar200._0_4_ * auVar81._0_4_ + fVar193;
          auVar246._4_4_ = auVar200._4_4_ * auVar81._4_4_ + fVar153;
          auVar246._8_4_ = auVar200._8_4_ * auVar81._8_4_ + fVar193;
          auVar246._12_4_ = auVar200._12_4_ * auVar81._12_4_ + fVar153;
          auVar296._8_8_ = auVar166._0_8_;
          auVar296._0_8_ = auVar166._0_8_;
          auVar104 = vshufpd_avx(auVar166,auVar166,1);
          auVar104 = vsubps_avx(auVar104,auVar296);
          auVar167._0_4_ = fVar173 + auVar200._0_4_ * auVar104._0_4_;
          auVar167._4_4_ = fVar194 + auVar200._4_4_ * auVar104._4_4_;
          auVar167._8_4_ = fVar173 + auVar200._8_4_ * auVar104._8_4_;
          auVar167._12_4_ = fVar194 + auVar200._12_4_ * auVar104._12_4_;
          auVar200 = vmovshdup_avx(auVar167);
          auVar297._0_8_ = auVar200._0_8_ ^ 0x8000000080000000;
          auVar297._8_4_ = auVar200._8_4_ ^ 0x80000000;
          auVar297._12_4_ = auVar200._12_4_ ^ 0x80000000;
          auVar191 = vmovshdup_avx(auVar81);
          auVar104 = vunpcklps_avx(auVar191,auVar297);
          auVar83 = vshufps_avx(auVar104,auVar297,4);
          auVar126._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
          auVar126._8_4_ = -auVar81._8_4_;
          auVar126._12_4_ = -auVar81._12_4_;
          auVar104 = vmovlhps_avx(auVar126,auVar167);
          auVar103 = vshufps_avx(auVar104,auVar167,8);
          auVar104 = ZEXT416((uint)(auVar191._0_4_ * auVar167._0_4_ - auVar200._0_4_ * auVar81._0_4_
                                   ));
          auVar200 = vshufps_avx(auVar104,auVar104,0);
          auVar104 = vdivps_avx(auVar83,auVar200);
          auVar200 = vdivps_avx(auVar103,auVar200);
          auVar103 = vinsertps_avx(auVar188,auVar253,0x1c);
          auVar81 = vinsertps_avx(auVar204,auVar266,0x1c);
          auVar86 = vinsertps_avx(auVar253,auVar188,0x4c);
          auVar122 = vinsertps_avx(auVar266,auVar204,0x4c);
          auVar191 = vmovsldup_avx(auVar104);
          auVar267._0_4_ = auVar191._0_4_ * auVar103._0_4_;
          auVar267._4_4_ = auVar191._4_4_ * auVar103._4_4_;
          auVar267._8_4_ = auVar191._8_4_ * auVar103._8_4_;
          auVar267._12_4_ = auVar191._12_4_ * auVar103._12_4_;
          auVar254._0_4_ = auVar191._0_4_ * auVar81._0_4_;
          auVar254._4_4_ = auVar191._4_4_ * auVar81._4_4_;
          auVar254._8_4_ = auVar191._8_4_ * auVar81._8_4_;
          auVar254._12_4_ = auVar191._12_4_ * auVar81._12_4_;
          auVar83 = vminps_avx(auVar267,auVar254);
          auVar191 = vmaxps_avx(auVar254,auVar267);
          auVar96 = vmovsldup_avx(auVar200);
          auVar319._0_4_ = auVar96._0_4_ * auVar86._0_4_;
          auVar319._4_4_ = auVar96._4_4_ * auVar86._4_4_;
          auVar319._8_4_ = auVar96._8_4_ * auVar86._8_4_;
          auVar319._12_4_ = auVar96._12_4_ * auVar86._12_4_;
          auVar255._0_4_ = auVar96._0_4_ * auVar122._0_4_;
          auVar255._4_4_ = auVar96._4_4_ * auVar122._4_4_;
          auVar255._8_4_ = auVar96._8_4_ * auVar122._8_4_;
          auVar255._12_4_ = auVar96._12_4_ * auVar122._12_4_;
          auVar96 = vminps_avx(auVar319,auVar255);
          auVar106._0_4_ = auVar83._0_4_ + auVar96._0_4_;
          auVar106._4_4_ = auVar83._4_4_ + auVar96._4_4_;
          auVar106._8_4_ = auVar83._8_4_ + auVar96._8_4_;
          auVar106._12_4_ = auVar83._12_4_ + auVar96._12_4_;
          auVar83 = vmaxps_avx(auVar255,auVar319);
          auVar96 = vsubps_avx(auVar216,auVar87);
          auVar134 = vsubps_avx(auVar227,auVar87);
          auVar228._0_4_ = auVar191._0_4_ + auVar83._0_4_;
          auVar228._4_4_ = auVar191._4_4_ + auVar83._4_4_;
          auVar228._8_4_ = auVar191._8_4_ + auVar83._8_4_;
          auVar228._12_4_ = auVar191._12_4_ + auVar83._12_4_;
          auVar268._8_8_ = 0x3f800000;
          auVar268._0_8_ = 0x3f800000;
          auVar191 = vsubps_avx(auVar268,auVar228);
          auVar83 = vsubps_avx(auVar268,auVar106);
          fVar195 = auVar96._0_4_;
          auVar269._0_4_ = fVar195 * auVar191._0_4_;
          fVar249 = auVar96._4_4_;
          auVar269._4_4_ = fVar249 * auVar191._4_4_;
          fVar313 = auVar96._8_4_;
          auVar269._8_4_ = fVar313 * auVar191._8_4_;
          fVar250 = auVar96._12_4_;
          auVar269._12_4_ = fVar250 * auVar191._12_4_;
          fVar173 = auVar134._0_4_;
          auVar229._0_4_ = auVar191._0_4_ * fVar173;
          fVar194 = auVar134._4_4_;
          auVar229._4_4_ = auVar191._4_4_ * fVar194;
          fVar154 = auVar134._8_4_;
          auVar229._8_4_ = auVar191._8_4_ * fVar154;
          fVar174 = auVar134._12_4_;
          auVar229._12_4_ = auVar191._12_4_ * fVar174;
          auVar308._0_4_ = fVar195 * auVar83._0_4_;
          auVar308._4_4_ = fVar249 * auVar83._4_4_;
          auVar308._8_4_ = fVar313 * auVar83._8_4_;
          auVar308._12_4_ = fVar250 * auVar83._12_4_;
          auVar107._0_4_ = fVar173 * auVar83._0_4_;
          auVar107._4_4_ = fVar194 * auVar83._4_4_;
          auVar107._8_4_ = fVar154 * auVar83._8_4_;
          auVar107._12_4_ = fVar174 * auVar83._12_4_;
          auVar191 = vminps_avx(auVar269,auVar308);
          auVar83 = vminps_avx(auVar229,auVar107);
          auVar96 = vminps_avx(auVar191,auVar83);
          auVar191 = vmaxps_avx(auVar308,auVar269);
          auVar83 = vmaxps_avx(auVar107,auVar229);
          auVar134 = vshufps_avx(auVar87,auVar87,0x54);
          auVar83 = vmaxps_avx(auVar83,auVar191);
          auVar135 = vshufps_avx(auVar246,auVar246,0);
          auVar156 = vshufps_avx(auVar246,auVar246,0x55);
          auVar191 = vhaddps_avx(auVar96,auVar96);
          auVar83 = vhaddps_avx(auVar83,auVar83);
          auVar230._0_4_ = auVar135._0_4_ * auVar104._0_4_ + auVar156._0_4_ * auVar200._0_4_;
          auVar230._4_4_ = auVar135._4_4_ * auVar104._4_4_ + auVar156._4_4_ * auVar200._4_4_;
          auVar230._8_4_ = auVar135._8_4_ * auVar104._8_4_ + auVar156._8_4_ * auVar200._8_4_;
          auVar230._12_4_ = auVar135._12_4_ * auVar104._12_4_ + auVar156._12_4_ * auVar200._12_4_;
          auVar96 = vsubps_avx(auVar134,auVar230);
          fVar193 = auVar96._0_4_ + auVar191._0_4_;
          fVar153 = auVar96._0_4_ + auVar83._0_4_;
          auVar191 = vmaxss_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar193));
          auVar83 = vminss_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar175));
          if (auVar191._0_4_ <= auVar83._0_4_) {
            auVar191 = vmovshdup_avx(auVar104);
            auVar142._0_4_ = auVar103._0_4_ * auVar191._0_4_;
            auVar142._4_4_ = auVar103._4_4_ * auVar191._4_4_;
            auVar142._8_4_ = auVar103._8_4_ * auVar191._8_4_;
            auVar142._12_4_ = auVar103._12_4_ * auVar191._12_4_;
            auVar108._0_4_ = auVar81._0_4_ * auVar191._0_4_;
            auVar108._4_4_ = auVar81._4_4_ * auVar191._4_4_;
            auVar108._8_4_ = auVar81._8_4_ * auVar191._8_4_;
            auVar108._12_4_ = auVar81._12_4_ * auVar191._12_4_;
            auVar83 = vminps_avx(auVar142,auVar108);
            auVar191 = vmaxps_avx(auVar108,auVar142);
            auVar103 = vmovshdup_avx(auVar200);
            auVar189._0_4_ = auVar103._0_4_ * auVar86._0_4_;
            auVar189._4_4_ = auVar103._4_4_ * auVar86._4_4_;
            auVar189._8_4_ = auVar103._8_4_ * auVar86._8_4_;
            auVar189._12_4_ = auVar103._12_4_ * auVar86._12_4_;
            auVar143._0_4_ = auVar103._0_4_ * auVar122._0_4_;
            auVar143._4_4_ = auVar103._4_4_ * auVar122._4_4_;
            auVar143._8_4_ = auVar103._8_4_ * auVar122._8_4_;
            auVar143._12_4_ = auVar103._12_4_ * auVar122._12_4_;
            auVar103 = vminps_avx(auVar189,auVar143);
            auVar205._0_4_ = auVar83._0_4_ + auVar103._0_4_;
            auVar205._4_4_ = auVar83._4_4_ + auVar103._4_4_;
            auVar205._8_4_ = auVar83._8_4_ + auVar103._8_4_;
            auVar205._12_4_ = auVar83._12_4_ + auVar103._12_4_;
            auVar83 = vmaxps_avx(auVar143,auVar189);
            auVar109._0_4_ = auVar191._0_4_ + auVar83._0_4_;
            auVar109._4_4_ = auVar191._4_4_ + auVar83._4_4_;
            auVar109._8_4_ = auVar191._8_4_ + auVar83._8_4_;
            auVar109._12_4_ = auVar191._12_4_ + auVar83._12_4_;
            auVar191 = vsubps_avx(auVar141,auVar109);
            auVar83 = vsubps_avx(auVar141,auVar205);
            auVar190._0_4_ = fVar195 * auVar191._0_4_;
            auVar190._4_4_ = fVar249 * auVar191._4_4_;
            auVar190._8_4_ = fVar313 * auVar191._8_4_;
            auVar190._12_4_ = fVar250 * auVar191._12_4_;
            auVar206._0_4_ = fVar195 * auVar83._0_4_;
            auVar206._4_4_ = fVar249 * auVar83._4_4_;
            auVar206._8_4_ = fVar313 * auVar83._8_4_;
            auVar206._12_4_ = fVar250 * auVar83._12_4_;
            auVar110._0_4_ = fVar173 * auVar191._0_4_;
            auVar110._4_4_ = fVar194 * auVar191._4_4_;
            auVar110._8_4_ = fVar154 * auVar191._8_4_;
            auVar110._12_4_ = fVar174 * auVar191._12_4_;
            auVar144._0_4_ = fVar173 * auVar83._0_4_;
            auVar144._4_4_ = fVar194 * auVar83._4_4_;
            auVar144._8_4_ = fVar154 * auVar83._8_4_;
            auVar144._12_4_ = fVar174 * auVar83._12_4_;
            auVar191 = vminps_avx(auVar190,auVar206);
            auVar83 = vminps_avx(auVar110,auVar144);
            auVar191 = vminps_avx(auVar191,auVar83);
            auVar83 = vmaxps_avx(auVar206,auVar190);
            auVar103 = vmaxps_avx(auVar144,auVar110);
            auVar191 = vhaddps_avx(auVar191,auVar191);
            auVar83 = vmaxps_avx(auVar103,auVar83);
            auVar83 = vhaddps_avx(auVar83,auVar83);
            auVar103 = vmovshdup_avx(auVar96);
            auVar81 = ZEXT416((uint)(auVar103._0_4_ + auVar191._0_4_));
            auVar191 = vmaxss_avx(_local_6b0,auVar81);
            auVar103 = ZEXT416((uint)(auVar103._0_4_ + auVar83._0_4_));
            auVar83 = vminss_avx(auVar103,auVar118);
            auVar256._8_4_ = 0x7fffffff;
            auVar256._0_8_ = 0x7fffffff7fffffff;
            auVar256._12_4_ = 0x7fffffff;
            if (auVar191._0_4_ <= auVar83._0_4_) {
              uVar77 = 0;
              auVar309._8_4_ = 0x3f800000;
              auVar309._0_8_ = &DAT_3f8000003f800000;
              auVar309._12_4_ = 0x3f800000;
              auVar310 = ZEXT1664(auVar309);
              auVar321 = ZEXT864(0) << 0x20;
              if ((fVar172 < fVar193) && (uVar77 = 0, fVar153 < fVar175)) {
                auVar191 = vcmpps_avx(auVar103,auVar118,1);
                auVar83 = vcmpps_avx(_local_6b0,auVar81,1);
                auVar191 = vandps_avx(auVar83,auVar191);
                uVar77 = auVar191._0_4_;
              }
              if (((uint)uVar78 < 4 && 0.001 <= fVar152) && (uVar77 & 1) == 0) {
                bVar54 = false;
              }
              else {
                lVar73 = 200;
                do {
                  fVar193 = auVar96._0_4_;
                  fVar152 = 1.0 - fVar193;
                  auVar191 = ZEXT416((uint)(fVar152 * fVar152 * fVar152));
                  auVar191 = vshufps_avx(auVar191,auVar191,0);
                  auVar83 = ZEXT416((uint)(fVar193 * 3.0 * fVar152 * fVar152));
                  auVar83 = vshufps_avx(auVar83,auVar83,0);
                  auVar103 = ZEXT416((uint)(fVar152 * fVar193 * fVar193 * 3.0));
                  auVar103 = vshufps_avx(auVar103,auVar103,0);
                  auVar81 = ZEXT416((uint)(fVar193 * fVar193 * fVar193));
                  auVar81 = vshufps_avx(auVar81,auVar81,0);
                  local_680._0_4_ = auVar82._0_4_;
                  local_680._4_4_ = auVar82._4_4_;
                  fStack_678 = auVar82._8_4_;
                  fStack_674 = auVar82._12_4_;
                  fVar152 = local_550 * auVar191._0_4_ +
                            local_560 * auVar83._0_4_ +
                            auVar81._0_4_ * (float)local_680._0_4_ + local_570 * auVar103._0_4_;
                  fVar193 = fStack_54c * auVar191._4_4_ +
                            fStack_55c * auVar83._4_4_ +
                            auVar81._4_4_ * (float)local_680._4_4_ + fStack_56c * auVar103._4_4_;
                  auVar111._0_8_ = CONCAT44(fVar193,fVar152);
                  auVar111._8_4_ =
                       fStack_548 * auVar191._8_4_ +
                       fStack_558 * auVar83._8_4_ +
                       auVar81._8_4_ * fStack_678 + fStack_568 * auVar103._8_4_;
                  auVar111._12_4_ =
                       fStack_544 * auVar191._12_4_ +
                       fStack_554 * auVar83._12_4_ +
                       auVar81._12_4_ * fStack_674 + fStack_564 * auVar103._12_4_;
                  auVar145._8_8_ = auVar111._0_8_;
                  auVar145._0_8_ = auVar111._0_8_;
                  auVar83 = vshufpd_avx(auVar111,auVar111,1);
                  auVar191 = vmovshdup_avx(auVar96);
                  auVar83 = vsubps_avx(auVar83,auVar145);
                  auVar112._0_4_ = auVar191._0_4_ * auVar83._0_4_ + fVar152;
                  auVar112._4_4_ = auVar191._4_4_ * auVar83._4_4_ + fVar193;
                  auVar112._8_4_ = auVar191._8_4_ * auVar83._8_4_ + fVar152;
                  auVar112._12_4_ = auVar191._12_4_ * auVar83._12_4_ + fVar193;
                  auVar191 = vshufps_avx(auVar112,auVar112,0);
                  auVar83 = vshufps_avx(auVar112,auVar112,0x55);
                  auVar146._0_4_ = auVar104._0_4_ * auVar191._0_4_ + auVar200._0_4_ * auVar83._0_4_;
                  auVar146._4_4_ = auVar104._4_4_ * auVar191._4_4_ + auVar200._4_4_ * auVar83._4_4_;
                  auVar146._8_4_ = auVar104._8_4_ * auVar191._8_4_ + auVar200._8_4_ * auVar83._8_4_;
                  auVar146._12_4_ =
                       auVar104._12_4_ * auVar191._12_4_ + auVar200._12_4_ * auVar83._12_4_;
                  auVar96 = vsubps_avx(auVar96,auVar146);
                  auVar191 = vandps_avx(auVar256,auVar112);
                  auVar83 = vshufps_avx(auVar191,auVar191,0xf5);
                  auVar191 = vmaxss_avx(auVar83,auVar191);
                  if (auVar191._0_4_ < fVar155) {
                    fVar152 = auVar96._0_4_;
                    if ((0.0 <= fVar152) && (fVar152 <= 1.0)) {
                      auVar104 = vmovshdup_avx(auVar96);
                      fVar193 = auVar104._0_4_;
                      if ((0.0 <= fVar193) && (fVar193 <= 1.0)) {
                        auVar104 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar122 = vinsertps_avx(auVar104,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar104 = vdpps_avx(auVar122,local_360,0x7f);
                        auVar200 = vdpps_avx(auVar122,local_370,0x7f);
                        auVar191 = vdpps_avx(auVar122,local_3a0,0x7f);
                        auVar83 = vdpps_avx(auVar122,local_3b0,0x7f);
                        auVar103 = vdpps_avx(auVar122,local_3c0,0x7f);
                        auVar81 = vdpps_avx(auVar122,local_3d0,0x7f);
                        fVar174 = 1.0 - fVar193;
                        auVar86 = vdpps_avx(auVar122,local_380,0x7f);
                        auVar122 = vdpps_avx(auVar122,local_390,0x7f);
                        fVar195 = 1.0 - fVar152;
                        fVar153 = auVar96._4_4_;
                        fVar173 = auVar96._8_4_;
                        fVar194 = auVar96._12_4_;
                        fVar154 = fVar195 * fVar152 * fVar152 * 3.0;
                        auVar192._0_4_ = fVar152 * fVar152 * fVar152;
                        auVar192._4_4_ = fVar153 * fVar153 * fVar153;
                        auVar192._8_4_ = fVar173 * fVar173 * fVar173;
                        auVar192._12_4_ = fVar194 * fVar194 * fVar194;
                        fVar153 = fVar152 * 3.0 * fVar195 * fVar195;
                        fVar173 = fVar195 * fVar195 * fVar195;
                        fVar152 = (fVar174 * auVar104._0_4_ + fVar193 * auVar191._0_4_) * fVar173 +
                                  (fVar174 * auVar200._0_4_ + fVar193 * auVar83._0_4_) * fVar153 +
                                  fVar154 * (fVar174 * auVar86._0_4_ + fVar193 * auVar103._0_4_) +
                                  auVar192._0_4_ *
                                  (auVar81._0_4_ * fVar193 + fVar174 * auVar122._0_4_);
                        if ((fVar133 <= fVar152) &&
                           (fVar193 = *(float *)(ray + k * 4 + 0x100), fVar152 <= fVar193)) {
                          pGVar10 = (context->scene->geometries).items[uVar71].ptr;
                          if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                            bVar80 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar80 = true,
                                  pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_f0 = vshufps_avx(auVar96,auVar96,0x55);
                            auVar104 = vsubps_avx(auVar309,local_f0);
                            fVar194 = local_f0._0_4_;
                            fVar174 = local_f0._4_4_;
                            fVar249 = local_f0._8_4_;
                            fVar313 = local_f0._12_4_;
                            fVar250 = auVar104._0_4_;
                            fVar260 = auVar104._4_4_;
                            fVar262 = auVar104._8_4_;
                            fVar271 = auVar104._12_4_;
                            auVar247._0_4_ =
                                 fVar194 * (float)local_4c0._0_4_ + fVar250 * (float)local_4b0._0_4_
                            ;
                            auVar247._4_4_ =
                                 fVar174 * (float)local_4c0._4_4_ + fVar260 * (float)local_4b0._4_4_
                            ;
                            auVar247._8_4_ = fVar249 * fStack_4b8 + fVar262 * fStack_4a8;
                            auVar247._12_4_ = fVar313 * fStack_4b4 + fVar271 * fStack_4a4;
                            auVar257._0_4_ =
                                 fVar194 * (float)local_500._0_4_ + fVar250 * (float)local_4e0._0_4_
                            ;
                            auVar257._4_4_ =
                                 fVar174 * (float)local_500._4_4_ + fVar260 * (float)local_4e0._4_4_
                            ;
                            auVar257._8_4_ = fVar249 * fStack_4f8 + fVar262 * fStack_4d8;
                            auVar257._12_4_ = fVar313 * fStack_4f4 + fVar271 * fStack_4d4;
                            auVar270._0_4_ =
                                 fVar194 * (float)local_400._0_4_ + fVar250 * (float)local_4f0._0_4_
                            ;
                            auVar270._4_4_ =
                                 fVar174 * (float)local_400._4_4_ + fVar260 * (float)local_4f0._4_4_
                            ;
                            auVar270._8_4_ = fVar249 * fStack_3f8 + fVar262 * fStack_4e8;
                            auVar270._12_4_ = fVar313 * fStack_3f4 + fVar271 * fStack_4e4;
                            auVar231._0_4_ = fVar194 * fVar117 + fVar250 * (float)local_4d0._0_4_;
                            auVar231._4_4_ = fVar174 * fVar315 + fVar260 * (float)local_4d0._4_4_;
                            auVar231._8_4_ = fVar249 * fVar259 + fVar262 * fStack_4c8;
                            auVar231._12_4_ = fVar313 * fVar261 + fVar271 * fStack_4c4;
                            auVar83 = vsubps_avx(auVar257,auVar247);
                            auVar103 = vsubps_avx(auVar270,auVar257);
                            auVar81 = vsubps_avx(auVar231,auVar270);
                            local_110 = vshufps_avx(auVar96,auVar96,0);
                            fVar194 = local_110._0_4_;
                            fVar249 = local_110._4_4_;
                            fVar313 = local_110._8_4_;
                            fVar260 = local_110._12_4_;
                            auVar104 = vshufps_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar195),0);
                            fVar174 = auVar104._0_4_;
                            fVar195 = auVar104._4_4_;
                            fVar250 = auVar104._8_4_;
                            fVar262 = auVar104._12_4_;
                            auVar104 = vshufps_avx(auVar192,auVar192,0);
                            auVar200 = vshufps_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),0);
                            auVar191 = vshufps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),0);
                            auVar168._0_4_ =
                                 ((auVar103._0_4_ * fVar174 + auVar81._0_4_ * fVar194) * fVar194 +
                                 (auVar83._0_4_ * fVar174 + auVar103._0_4_ * fVar194) * fVar174) *
                                 3.0;
                            auVar168._4_4_ =
                                 ((auVar103._4_4_ * fVar195 + auVar81._4_4_ * fVar249) * fVar249 +
                                 (auVar83._4_4_ * fVar195 + auVar103._4_4_ * fVar249) * fVar195) *
                                 3.0;
                            auVar168._8_4_ =
                                 ((auVar103._8_4_ * fVar250 + auVar81._8_4_ * fVar313) * fVar313 +
                                 (auVar83._8_4_ * fVar250 + auVar103._8_4_ * fVar313) * fVar250) *
                                 3.0;
                            auVar168._12_4_ =
                                 ((auVar103._12_4_ * fVar262 + auVar81._12_4_ * fVar260) * fVar260 +
                                 (auVar83._12_4_ * fVar262 + auVar103._12_4_ * fVar260) * fVar262) *
                                 3.0;
                            auVar83 = vshufps_avx(ZEXT416((uint)fVar173),ZEXT416((uint)fVar173),0);
                            auVar127._0_4_ =
                                 auVar83._0_4_ * (float)local_410._0_4_ +
                                 auVar191._0_4_ * (float)local_420._0_4_ +
                                 auVar104._0_4_ * (float)local_440._0_4_ +
                                 auVar200._0_4_ * (float)local_430._0_4_;
                            auVar127._4_4_ =
                                 auVar83._4_4_ * (float)local_410._4_4_ +
                                 auVar191._4_4_ * (float)local_420._4_4_ +
                                 auVar104._4_4_ * (float)local_440._4_4_ +
                                 auVar200._4_4_ * (float)local_430._4_4_;
                            auVar127._8_4_ =
                                 auVar83._8_4_ * fStack_408 +
                                 auVar191._8_4_ * fStack_418 +
                                 auVar104._8_4_ * fStack_438 + auVar200._8_4_ * fStack_428;
                            auVar127._12_4_ =
                                 auVar83._12_4_ * fStack_404 +
                                 auVar191._12_4_ * fStack_414 +
                                 auVar104._12_4_ * fStack_434 + auVar200._12_4_ * fStack_424;
                            auVar104 = vshufps_avx(auVar168,auVar168,0xc9);
                            auVar147._0_4_ = auVar127._0_4_ * auVar104._0_4_;
                            auVar147._4_4_ = auVar127._4_4_ * auVar104._4_4_;
                            auVar147._8_4_ = auVar127._8_4_ * auVar104._8_4_;
                            auVar147._12_4_ = auVar127._12_4_ * auVar104._12_4_;
                            auVar104 = vshufps_avx(auVar127,auVar127,0xc9);
                            auVar128._0_4_ = auVar168._0_4_ * auVar104._0_4_;
                            auVar128._4_4_ = auVar168._4_4_ * auVar104._4_4_;
                            auVar128._8_4_ = auVar168._8_4_ * auVar104._8_4_;
                            auVar128._12_4_ = auVar168._12_4_ * auVar104._12_4_;
                            auVar104 = vsubps_avx(auVar128,auVar147);
                            local_170 = vshufps_avx(auVar104,auVar104,0x55);
                            local_180[0] = (RTCHitN)local_170[0];
                            local_180[1] = (RTCHitN)local_170[1];
                            local_180[2] = (RTCHitN)local_170[2];
                            local_180[3] = (RTCHitN)local_170[3];
                            local_180[4] = (RTCHitN)local_170[4];
                            local_180[5] = (RTCHitN)local_170[5];
                            local_180[6] = (RTCHitN)local_170[6];
                            local_180[7] = (RTCHitN)local_170[7];
                            local_180[8] = (RTCHitN)local_170[8];
                            local_180[9] = (RTCHitN)local_170[9];
                            local_180[10] = (RTCHitN)local_170[10];
                            local_180[0xb] = (RTCHitN)local_170[0xb];
                            local_180[0xc] = (RTCHitN)local_170[0xc];
                            local_180[0xd] = (RTCHitN)local_170[0xd];
                            local_180[0xe] = (RTCHitN)local_170[0xe];
                            local_180[0xf] = (RTCHitN)local_170[0xf];
                            local_150 = vshufps_avx(auVar104,auVar104,0xaa);
                            local_160 = local_150;
                            local_130 = vshufps_avx(auVar104,auVar104,0);
                            local_140 = local_130;
                            local_120 = local_110;
                            local_100 = local_f0;
                            local_e0 = local_2e0._0_8_;
                            uStack_d8 = local_2e0._8_8_;
                            uStack_d0 = local_2e0._16_8_;
                            uStack_c8 = local_2e0._24_8_;
                            local_c0 = local_2c0._0_8_;
                            uStack_b8 = local_2c0._8_8_;
                            uStack_b0 = local_2c0._16_8_;
                            uStack_a8 = local_2c0._24_8_;
                            auVar89 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar89._28_4_;
                            uVar77 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar152;
                            local_510 = *(undefined8 *)(mm_lookupmask_ps + lVar75);
                            uStack_508 = *(undefined8 *)(mm_lookupmask_ps + lVar75 + 8);
                            local_520 = *(undefined8 *)(mm_lookupmask_ps + uVar72);
                            uStack_518 = *(undefined8 *)(mm_lookupmask_ps + uVar72 + 8);
                            local_470.valid = (int *)&local_520;
                            local_470.geometryUserPtr = pGVar10->userPtr;
                            local_470.context = context->user;
                            local_470.ray = (RTCRayN *)ray;
                            local_470.hit = local_180;
                            local_470.N = 8;
                            if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar10->occlusionFilterN)(&local_470);
                              auVar321 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar310 = ZEXT1664(CONCAT412(0x3f800000,
                                                            CONCAT48(0x3f800000,
                                                                     &DAT_3f8000003f800000)));
                            }
                            auVar66._8_8_ = uStack_518;
                            auVar66._0_8_ = local_520;
                            auVar104 = vpcmpeqd_avx(auVar321._0_16_,auVar66);
                            auVar68._8_8_ = uStack_508;
                            auVar68._0_8_ = local_510;
                            auVar200 = vpcmpeqd_avx(auVar321._0_16_,auVar68);
                            auVar93._16_16_ = auVar200;
                            auVar93._0_16_ = auVar104;
                            auVar22 = auVar89 & ~auVar93;
                            if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar22 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar22 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar22 >> 0x7f,0) == '\0') &&
                                  (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar22 >> 0xbf,0) == '\0') &&
                                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar22[0x1f]) {
                              auVar94._0_4_ = auVar104._0_4_ ^ auVar89._0_4_;
                              auVar94._4_4_ = auVar104._4_4_ ^ auVar89._4_4_;
                              auVar94._8_4_ = auVar104._8_4_ ^ auVar89._8_4_;
                              auVar94._12_4_ = auVar104._12_4_ ^ auVar89._12_4_;
                              auVar94._16_4_ = auVar200._0_4_ ^ auVar89._16_4_;
                              auVar94._20_4_ = auVar200._4_4_ ^ auVar89._20_4_;
                              auVar94._24_4_ = auVar200._8_4_ ^ auVar89._24_4_;
                              auVar94._28_4_ = auVar200._12_4_ ^ uVar77;
                            }
                            else {
                              p_Var11 = context->args->filter;
                              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var11)(&local_470);
                                auVar321 = ZEXT1664(ZEXT816(0) << 0x40);
                                auVar310 = ZEXT1664(CONCAT412(0x3f800000,
                                                              CONCAT48(0x3f800000,
                                                                       &DAT_3f8000003f800000)));
                              }
                              auVar67._8_8_ = uStack_518;
                              auVar67._0_8_ = local_520;
                              auVar104 = vpcmpeqd_avx(auVar321._0_16_,auVar67);
                              auVar69._8_8_ = uStack_508;
                              auVar69._0_8_ = local_510;
                              auVar200 = vpcmpeqd_avx(auVar321._0_16_,auVar69);
                              auVar115._16_16_ = auVar200;
                              auVar115._0_16_ = auVar104;
                              auVar94._0_4_ = auVar104._0_4_ ^ auVar89._0_4_;
                              auVar94._4_4_ = auVar104._4_4_ ^ auVar89._4_4_;
                              auVar94._8_4_ = auVar104._8_4_ ^ auVar89._8_4_;
                              auVar94._12_4_ = auVar104._12_4_ ^ auVar89._12_4_;
                              auVar94._16_4_ = auVar200._0_4_ ^ auVar89._16_4_;
                              auVar94._20_4_ = auVar200._4_4_ ^ auVar89._20_4_;
                              auVar94._24_4_ = auVar200._8_4_ ^ auVar89._24_4_;
                              auVar94._28_4_ = auVar200._12_4_ ^ uVar77;
                              auVar132._8_4_ = 0xff800000;
                              auVar132._0_8_ = 0xff800000ff800000;
                              auVar132._12_4_ = 0xff800000;
                              auVar132._16_4_ = 0xff800000;
                              auVar132._20_4_ = 0xff800000;
                              auVar132._24_4_ = 0xff800000;
                              auVar132._28_4_ = 0xff800000;
                              auVar89 = vblendvps_avx(auVar132,*(undefined1 (*) [32])
                                                                (local_470.ray + 0x100),auVar115);
                              *(undefined1 (*) [32])(local_470.ray + 0x100) = auVar89;
                            }
                            bVar62 = (auVar94 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar63 = (auVar94 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar61 = (auVar94 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar60 = SUB321(auVar94 >> 0x7f,0) != '\0';
                            bVar59 = (auVar94 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar56 = SUB321(auVar94 >> 0xbf,0) != '\0';
                            bVar55 = (auVar94 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar80 = auVar94[0x1f] < '\0';
                            if (((((((!bVar62 && !bVar63) && !bVar61) && !bVar60) && !bVar59) &&
                                 !bVar56) && !bVar55) && !bVar80) {
                              *(float *)(ray + k * 4 + 0x100) = fVar193;
                            }
                            bVar80 = ((((((bVar62 || bVar63) || bVar61) || bVar60) || bVar59) ||
                                      bVar56) || bVar55) || bVar80;
                          }
                          bVar70 = (bool)(bVar70 | bVar80);
                        }
                      }
                    }
                    break;
                  }
                  lVar73 = lVar73 + -1;
                } while (lVar73 != 0);
              }
              goto LAB_00ee8b50;
            }
          }
          goto LAB_00ee8ed2;
        }
      }
LAB_00ee8b50:
    } while (bVar54);
    local_3e0 = vinsertps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar175),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }